

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::UnaryOp_x86_fma::forward_inplace(UnaryOp_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  float *pfVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  undefined1 (*pauVar16) [32];
  undefined1 (*pauVar17) [16];
  uint uVar18;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar19;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar34 [16];
  undefined1 auVar57 [32];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined1 auVar60 [64];
  __m256 afVar41;
  undefined1 auVar96 [56];
  undefined1 auVar61 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar42 [32];
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dd_09;
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dd_10;
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar43 [32];
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 extraout_XMM0_Dd_17;
  undefined1 auVar68 [64];
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dc_20;
  undefined4 extraout_XMM0_Dd_18;
  undefined4 extraout_XMM0_Dd_19;
  undefined4 extraout_XMM0_Dd_20;
  undefined1 auVar69 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar44 [32];
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Dc_21;
  undefined4 extraout_XMM0_Dd_21;
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Dc_22;
  undefined4 extraout_XMM0_Dd_22;
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar47 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Dc_23;
  undefined4 extraout_XMM0_Dd_23;
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Dc_24;
  undefined4 extraout_XMM0_Dd_24;
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  undefined4 extraout_XMM0_Db_27;
  undefined4 extraout_XMM0_Db_28;
  undefined4 extraout_XMM0_Db_29;
  undefined4 extraout_XMM0_Db_30;
  undefined4 extraout_XMM0_Db_31;
  undefined4 extraout_XMM0_Dc_25;
  undefined4 extraout_XMM0_Dc_26;
  undefined4 extraout_XMM0_Dc_27;
  undefined4 extraout_XMM0_Dc_28;
  undefined4 extraout_XMM0_Dc_29;
  undefined4 extraout_XMM0_Dc_30;
  undefined4 extraout_XMM0_Dc_31;
  undefined4 extraout_XMM0_Dd_25;
  undefined4 extraout_XMM0_Dd_26;
  undefined4 extraout_XMM0_Dd_27;
  undefined4 extraout_XMM0_Dd_28;
  undefined4 extraout_XMM0_Dd_29;
  undefined4 extraout_XMM0_Dd_30;
  undefined4 extraout_XMM0_Dd_31;
  undefined1 auVar82 [64];
  undefined4 extraout_XMM0_Db_32;
  undefined4 extraout_XMM0_Db_33;
  undefined4 extraout_XMM0_Db_34;
  undefined4 extraout_XMM0_Dc_32;
  undefined4 extraout_XMM0_Dc_33;
  undefined4 extraout_XMM0_Dc_34;
  undefined4 extraout_XMM0_Dd_32;
  undefined4 extraout_XMM0_Dd_33;
  undefined4 extraout_XMM0_Dd_34;
  undefined1 auVar83 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar53 [32];
  undefined4 extraout_XMM0_Db_35;
  undefined4 extraout_XMM0_Dc_35;
  undefined4 extraout_XMM0_Dd_35;
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined4 extraout_XMM0_Db_36;
  undefined4 extraout_XMM0_Dc_36;
  undefined4 extraout_XMM0_Dd_36;
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar56 [32];
  undefined4 extraout_XMM0_Db_37;
  undefined4 extraout_XMM0_Dc_37;
  undefined4 extraout_XMM0_Dd_37;
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined4 extraout_XMM0_Db_38;
  undefined4 extraout_XMM0_Dc_38;
  undefined4 extraout_XMM0_Dd_38;
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar271 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar311 [32];
  undefined1 auVar310 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar312 [64];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  __m128 afVar325;
  unary_op_tan op;
  unary_op_tan local_151;
  undefined1 local_150 [16];
  undefined1 local_140 [8];
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined8 local_128;
  undefined1 local_120 [16];
  undefined8 local_110;
  Mat *local_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  long local_60;
  undefined1 auVar37 [32];
  undefined1 auVar48 [32];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [60];
  undefined1 extraout_var_08 [60];
  undefined1 extraout_var_09 [60];
  undefined1 extraout_var_10 [60];
  undefined1 extraout_var_11 [60];
  undefined1 extraout_var_12 [60];
  undefined1 extraout_var_13 [60];
  undefined1 extraout_var_14 [60];
  undefined1 extraout_var_15 [60];
  undefined1 extraout_var_16 [60];
  undefined1 extraout_var_17 [60];
  undefined1 extraout_var_18 [60];
  undefined1 extraout_var_19 [60];
  undefined1 extraout_var_20 [60];
  undefined1 extraout_var_21 [60];
  undefined1 extraout_var_22 [60];
  undefined1 extraout_var_23 [60];
  undefined1 extraout_var_24 [60];
  undefined1 extraout_var_25 [60];
  undefined1 extraout_var_26 [60];
  undefined1 extraout_var_27 [60];
  undefined1 extraout_var_28 [60];
  undefined1 extraout_var_29 [60];
  undefined1 extraout_var_30 [60];
  undefined1 extraout_var_31 [60];
  undefined1 extraout_var_32 [60];
  undefined1 extraout_var_33 [60];
  undefined1 extraout_var_34 [60];
  
  auVar47 = _DAT_00512ca0;
  auVar37 = _DAT_00512c80;
  auVar20 = in_ZMM3._0_16_;
  auVar98 = in_ZMM5._0_16_;
  local_108 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_UnaryOp_x86_fma[-3])) {
  case 0:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar15 = 0;
      auVar97._8_4_ = 0x7fffffff;
      auVar97._0_8_ = 0x7fffffff7fffffff;
      auVar97._12_4_ = 0x7fffffff;
      auVar145._8_8_ = 0x8000000000000000;
      auVar145._0_8_ = 0x8000000000000000;
      auVar20 = vpcmpeqd_avx(auVar98,auVar98);
      auVar197._8_4_ = 0x7fffffff;
      auVar197._0_8_ = 0x7fffffff7fffffff;
      auVar197._12_4_ = 0x7fffffff;
      auVar197._16_4_ = 0x7fffffff;
      auVar197._20_4_ = 0x7fffffff;
      auVar197._24_4_ = 0x7fffffff;
      auVar197._28_4_ = 0x7fffffff;
      do {
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar128 = *pauVar16;
            auVar231._0_8_ = auVar128._0_8_ ^ 0x8000000080000000;
            auVar231._8_4_ = auVar128._8_4_ ^ 0x80000000;
            auVar231._12_4_ = auVar128._12_4_ ^ 0x80000000;
            auVar231._16_4_ = auVar128._16_4_ ^ 0x80000000;
            auVar231._20_4_ = auVar128._20_4_ ^ 0x80000000;
            auVar231._24_4_ = auVar128._24_4_ ^ 0x80000000;
            auVar231._28_4_ = auVar128._28_4_ ^ 0x80000000;
            auVar128 = vmaxps_avx(auVar231,auVar128);
            *pauVar16 = auVar128;
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
            uVar8 = uVar18 & 0xfffffff8;
          } while (iVar13 < (int)uVar18);
        }
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar98 = vandps_avx(auVar97,*(undefined1 (*) [16])*pauVar16);
          *(undefined1 (*) [16])*pauVar16 = auVar98;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if ((int)uVar8 < (int)uVar18) {
          uVar9 = CONCAT44(0,~uVar8 + uVar18);
          auVar203._8_8_ = 0;
          auVar203._0_8_ = uVar9;
          auVar175 = vpshufd_avx(auVar203,0x44);
          auVar98 = vorps_avx(auVar175,auVar145);
          auVar109 = vorps_avx(auVar175,auVar145);
          auVar175 = vorps_avx(auVar175,auVar145);
          uVar14 = 0;
          do {
            auVar259._8_8_ = 0;
            auVar259._0_8_ = uVar14;
            auVar223 = vpshufd_avx(auVar259,0x44);
            auVar268._16_16_ = auVar223;
            auVar268._0_16_ = auVar223;
            auVar128 = vorps_avx(auVar268,auVar37);
            auVar141 = vorps_avx(auVar268,auVar47);
            auVar287._0_8_ = auVar141._16_8_ ^ 0x8000000000000000;
            auVar287._8_4_ = auVar141._24_4_;
            auVar287._12_4_ = auVar141._28_4_ ^ 0x80000000;
            auVar223 = vpcmpgtq_avx(auVar287,auVar98);
            auVar260._0_8_ = auVar141._0_8_ ^ 0x8000000000000000;
            auVar260._8_4_ = auVar141._8_4_;
            auVar260._12_4_ = auVar141._12_4_ ^ 0x80000000;
            auVar233 = vpcmpgtq_avx(auVar260,auVar109);
            auVar223 = vpackssdw_avx(auVar233,auVar223);
            auVar288._0_8_ = auVar128._16_8_ ^ 0x8000000000000000;
            auVar288._8_4_ = auVar128._24_4_;
            auVar288._12_4_ = auVar128._28_4_ ^ 0x80000000;
            auVar233 = vpcmpgtq_avx(auVar288,auVar98);
            auVar273._0_8_ = auVar128._0_8_ ^ 0x8000000000000000;
            auVar273._8_4_ = auVar128._8_4_;
            auVar273._12_4_ = auVar128._12_4_ ^ 0x80000000;
            auVar261 = vpcmpgtq_avx(auVar273,auVar175);
            auVar233 = vpackssdw_avx(auVar261,auVar233);
            auVar223 = vpackssdw_avx(auVar233 ^ auVar20,auVar223 ^ auVar20);
            auVar233 = vpmovsxwd_avx(auVar223);
            auVar223 = vpunpckhwd_avx(auVar223,auVar223);
            auVar269._16_16_ = auVar223;
            auVar269._0_16_ = auVar233;
            auVar128 = vmaskmovps_avx(auVar269,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            auVar128 = vandps_avx(auVar128,auVar197);
            auVar128 = vmaskmovps_avx(auVar269,auVar128);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar128;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar7);
    }
    break;
  case 1:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar15 = 0;
      auVar155._8_8_ = 0x8000000000000000;
      auVar155._0_8_ = 0x8000000000000000;
      auVar20 = vpcmpeqd_avx(auVar98,auVar98);
      do {
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar128 = *pauVar16;
            auVar200._0_8_ = auVar128._0_8_ ^ 0x8000000080000000;
            auVar200._8_4_ = auVar128._8_4_ ^ 0x80000000;
            auVar200._12_4_ = auVar128._12_4_ ^ 0x80000000;
            auVar200._16_4_ = auVar128._16_4_ ^ 0x80000000;
            auVar200._20_4_ = auVar128._20_4_ ^ 0x80000000;
            auVar200._24_4_ = auVar128._24_4_ ^ 0x80000000;
            auVar200._28_4_ = auVar128._28_4_ ^ 0x80000000;
            *pauVar16 = auVar200;
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
            uVar8 = uVar18 & 0xfffffff8;
          } while (iVar13 < (int)uVar18);
        }
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar98 = *(undefined1 (*) [16])*pauVar16;
          auVar191._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
          auVar191._8_4_ = auVar98._8_4_ ^ 0x80000000;
          auVar191._12_4_ = auVar98._12_4_ ^ 0x80000000;
          *(undefined1 (*) [16])*pauVar16 = auVar191;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if ((int)uVar8 < (int)uVar18) {
          uVar9 = CONCAT44(0,~uVar8 + uVar18);
          auVar192._8_8_ = 0;
          auVar192._0_8_ = uVar9;
          auVar175 = vpshufd_avx(auVar192,0x44);
          auVar98 = vorps_avx(auVar175,auVar155);
          auVar109 = vorps_avx(auVar175,auVar155);
          auVar175 = vorps_avx(auVar175,auVar155);
          uVar14 = 0;
          do {
            auVar244._8_8_ = 0;
            auVar244._0_8_ = uVar14;
            auVar223 = vpshufd_avx(auVar244,0x44);
            auVar254._16_16_ = auVar223;
            auVar254._0_16_ = auVar223;
            auVar128 = vorps_avx(auVar254,auVar37);
            auVar141 = vorps_avx(auVar254,auVar47);
            auVar279._0_8_ = auVar141._16_8_ ^ 0x8000000000000000;
            auVar279._8_4_ = auVar141._24_4_;
            auVar279._12_4_ = auVar141._28_4_ ^ 0x80000000;
            auVar223 = vpcmpgtq_avx(auVar279,auVar98);
            auVar245._0_8_ = auVar141._0_8_ ^ 0x8000000000000000;
            auVar245._8_4_ = auVar141._8_4_;
            auVar245._12_4_ = auVar141._12_4_ ^ 0x80000000;
            auVar233 = vpcmpgtq_avx(auVar245,auVar109);
            auVar223 = vpackssdw_avx(auVar233,auVar223);
            auVar280._0_8_ = auVar128._16_8_ ^ 0x8000000000000000;
            auVar280._8_4_ = auVar128._24_4_;
            auVar280._12_4_ = auVar128._28_4_ ^ 0x80000000;
            auVar233 = vpcmpgtq_avx(auVar280,auVar98);
            auVar265._0_8_ = auVar128._0_8_ ^ 0x8000000000000000;
            auVar265._8_4_ = auVar128._8_4_;
            auVar265._12_4_ = auVar128._12_4_ ^ 0x80000000;
            auVar261 = vpcmpgtq_avx(auVar265,auVar175);
            auVar233 = vpackssdw_avx(auVar261,auVar233);
            auVar223 = vpackssdw_avx(auVar233 ^ auVar20,auVar223 ^ auVar20);
            auVar233 = vpmovsxwd_avx(auVar223);
            auVar223 = vpunpckhwd_avx(auVar223,auVar223);
            auVar255._16_16_ = auVar223;
            auVar255._0_16_ = auVar233;
            auVar128 = vmaskmovps_avx(auVar255,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            auVar271._0_8_ = auVar128._0_8_ ^ 0x8000000080000000;
            auVar271._8_4_ = auVar128._8_4_ ^ 0x80000000;
            auVar271._12_4_ = auVar128._12_4_ ^ 0x80000000;
            auVar271._16_4_ = auVar128._16_4_ ^ 0x80000000;
            auVar271._20_4_ = auVar128._20_4_ ^ 0x80000000;
            auVar271._24_4_ = auVar128._24_4_ ^ 0x80000000;
            auVar271._28_4_ = auVar128._28_4_ ^ 0x80000000;
            auVar128 = vmaskmovps_avx(auVar255,auVar271);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar128;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar7);
    }
    break;
  case 2:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar15 = 0;
      auVar118._8_8_ = 0x8000000000000000;
      auVar118._0_8_ = 0x8000000000000000;
      auVar20 = vpcmpeqd_avx(auVar20,auVar20);
      do {
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar128 = vroundps_avx(*pauVar16,1);
            *pauVar16 = auVar128;
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
            uVar8 = uVar18 & 0xfffffff8;
          } while (iVar13 < (int)uVar18);
        }
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar98 = vroundps_avx(*(undefined1 (*) [16])*pauVar16,1);
          *(undefined1 (*) [16])*pauVar16 = auVar98;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if ((int)uVar8 < (int)uVar18) {
          uVar9 = CONCAT44(0,~uVar8 + uVar18);
          auVar150._8_8_ = 0;
          auVar150._0_8_ = uVar9;
          auVar175 = vpshufd_avx(auVar150,0x44);
          auVar98 = vorps_avx(auVar175,auVar118);
          auVar109 = vorps_avx(auVar175,auVar118);
          auVar175 = vorps_avx(auVar175,auVar118);
          uVar14 = 0;
          do {
            auVar207._8_8_ = 0;
            auVar207._0_8_ = uVar14;
            auVar223 = vpshufd_avx(auVar207,0x44);
            auVar217._16_16_ = auVar223;
            auVar217._0_16_ = auVar223;
            auVar128 = vorps_avx(auVar217,auVar37);
            auVar141 = vorps_avx(auVar217,auVar47);
            auVar237._0_8_ = auVar141._16_8_ ^ 0x8000000000000000;
            auVar237._8_4_ = auVar141._24_4_;
            auVar237._12_4_ = auVar141._28_4_ ^ 0x80000000;
            auVar223 = vpcmpgtq_avx(auVar237,auVar98);
            auVar208._0_8_ = auVar141._0_8_ ^ 0x8000000000000000;
            auVar208._8_4_ = auVar141._8_4_;
            auVar208._12_4_ = auVar141._12_4_ ^ 0x80000000;
            auVar233 = vpcmpgtq_avx(auVar208,auVar109);
            auVar223 = vpackssdw_avx(auVar233,auVar223);
            auVar238._0_8_ = auVar128._16_8_ ^ 0x8000000000000000;
            auVar238._8_4_ = auVar128._24_4_;
            auVar238._12_4_ = auVar128._28_4_ ^ 0x80000000;
            auVar233 = vpcmpgtq_avx(auVar238,auVar98);
            auVar225._0_8_ = auVar128._0_8_ ^ 0x8000000000000000;
            auVar225._8_4_ = auVar128._8_4_;
            auVar225._12_4_ = auVar128._12_4_ ^ 0x80000000;
            auVar261 = vpcmpgtq_avx(auVar225,auVar175);
            auVar233 = vpackssdw_avx(auVar261,auVar233);
            auVar223 = vpackssdw_avx(auVar233 ^ auVar20,auVar223 ^ auVar20);
            auVar233 = vpmovsxwd_avx(auVar223);
            auVar223 = vpunpckhwd_avx(auVar223,auVar223);
            auVar218._16_16_ = auVar223;
            auVar218._0_16_ = auVar233;
            auVar128 = vmaskmovps_avx(auVar218,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            auVar128 = vroundps_avx(auVar128,9);
            auVar128 = vmaskmovps_avx(auVar218,auVar128);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar128;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar7);
    }
    break;
  case 3:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar15 = 0;
      auVar119._8_8_ = 0x8000000000000000;
      auVar119._0_8_ = 0x8000000000000000;
      auVar20 = vpcmpeqd_avx(auVar20,auVar20);
      do {
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar128 = vroundps_avx(*pauVar16,2);
            *pauVar16 = auVar128;
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
            uVar8 = uVar18 & 0xfffffff8;
          } while (iVar13 < (int)uVar18);
        }
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar98 = vroundps_avx(*(undefined1 (*) [16])*pauVar16,2);
          *(undefined1 (*) [16])*pauVar16 = auVar98;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if ((int)uVar8 < (int)uVar18) {
          uVar9 = CONCAT44(0,~uVar8 + uVar18);
          auVar152._8_8_ = 0;
          auVar152._0_8_ = uVar9;
          auVar175 = vpshufd_avx(auVar152,0x44);
          auVar98 = vorps_avx(auVar175,auVar119);
          auVar109 = vorps_avx(auVar175,auVar119);
          auVar175 = vorps_avx(auVar175,auVar119);
          uVar14 = 0;
          do {
            auVar209._8_8_ = 0;
            auVar209._0_8_ = uVar14;
            auVar223 = vpshufd_avx(auVar209,0x44);
            auVar219._16_16_ = auVar223;
            auVar219._0_16_ = auVar223;
            auVar128 = vorps_avx(auVar219,auVar37);
            auVar141 = vorps_avx(auVar219,auVar47);
            auVar241._0_8_ = auVar141._16_8_ ^ 0x8000000000000000;
            auVar241._8_4_ = auVar141._24_4_;
            auVar241._12_4_ = auVar141._28_4_ ^ 0x80000000;
            auVar223 = vpcmpgtq_avx(auVar241,auVar98);
            auVar210._0_8_ = auVar141._0_8_ ^ 0x8000000000000000;
            auVar210._8_4_ = auVar141._8_4_;
            auVar210._12_4_ = auVar141._12_4_ ^ 0x80000000;
            auVar233 = vpcmpgtq_avx(auVar210,auVar109);
            auVar223 = vpackssdw_avx(auVar233,auVar223);
            auVar242._0_8_ = auVar128._16_8_ ^ 0x8000000000000000;
            auVar242._8_4_ = auVar128._24_4_;
            auVar242._12_4_ = auVar128._28_4_ ^ 0x80000000;
            auVar233 = vpcmpgtq_avx(auVar242,auVar98);
            auVar226._0_8_ = auVar128._0_8_ ^ 0x8000000000000000;
            auVar226._8_4_ = auVar128._8_4_;
            auVar226._12_4_ = auVar128._12_4_ ^ 0x80000000;
            auVar261 = vpcmpgtq_avx(auVar226,auVar175);
            auVar233 = vpackssdw_avx(auVar261,auVar233);
            auVar223 = vpackssdw_avx(auVar233 ^ auVar20,auVar223 ^ auVar20);
            auVar233 = vpmovsxwd_avx(auVar223);
            auVar223 = vpunpckhwd_avx(auVar223,auVar223);
            auVar220._16_16_ = auVar223;
            auVar220._0_16_ = auVar233;
            auVar128 = vmaskmovps_avx(auVar220,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            auVar128 = vroundps_avx(auVar128,10);
            auVar128 = vmaskmovps_avx(auVar220,auVar128);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar128;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar7);
    }
    break;
  case 4:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar15 = 0;
      auVar117._8_8_ = 0x8000000000000000;
      auVar117._0_8_ = 0x8000000000000000;
      auVar20 = vpcmpeqd_avx(auVar20,auVar20);
      do {
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar2._4_4_ = *(float *)(*pauVar16 + 4) * *(float *)(*pauVar16 + 4);
            auVar2._0_4_ = *(float *)*pauVar16 * *(float *)*pauVar16;
            auVar2._8_4_ = *(float *)(*pauVar16 + 8) * *(float *)(*pauVar16 + 8);
            auVar2._12_4_ = *(float *)(*pauVar16 + 0xc) * *(float *)(*pauVar16 + 0xc);
            auVar2._16_4_ = *(float *)(*pauVar16 + 0x10) * *(float *)(*pauVar16 + 0x10);
            auVar2._20_4_ = *(float *)(*pauVar16 + 0x14) * *(float *)(*pauVar16 + 0x14);
            auVar2._24_4_ = *(float *)(*pauVar16 + 0x18) * *(float *)(*pauVar16 + 0x18);
            auVar2._28_4_ = *(undefined4 *)(*pauVar16 + 0x1c);
            *pauVar16 = auVar2;
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
            uVar8 = uVar18 & 0xfffffff8;
          } while (iVar13 < (int)uVar18);
        }
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar146._0_4_ = *(float *)*pauVar16 * *(float *)*pauVar16;
          auVar146._4_4_ = *(float *)(*pauVar16 + 4) * *(float *)(*pauVar16 + 4);
          auVar146._8_4_ = *(float *)(*pauVar16 + 8) * *(float *)(*pauVar16 + 8);
          auVar146._12_4_ = *(float *)(*pauVar16 + 0xc) * *(float *)(*pauVar16 + 0xc);
          *(undefined1 (*) [16])*pauVar16 = auVar146;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if ((int)uVar8 < (int)uVar18) {
          uVar9 = CONCAT44(0,~uVar8 + uVar18);
          auVar147._8_8_ = 0;
          auVar147._0_8_ = uVar9;
          auVar175 = vpshufd_avx(auVar147,0x44);
          auVar98 = vorps_avx(auVar175,auVar117);
          auVar109 = vorps_avx(auVar175,auVar117);
          auVar175 = vorps_avx(auVar175,auVar117);
          uVar14 = 0;
          do {
            auVar204._8_8_ = 0;
            auVar204._0_8_ = uVar14;
            auVar223 = vpshufd_avx(auVar204,0x44);
            auVar215._16_16_ = auVar223;
            auVar215._0_16_ = auVar223;
            auVar128 = vorps_avx(auVar215,auVar37);
            auVar141 = vorps_avx(auVar215,auVar47);
            auVar234._0_8_ = auVar141._16_8_ ^ 0x8000000000000000;
            auVar234._8_4_ = auVar141._24_4_;
            auVar234._12_4_ = auVar141._28_4_ ^ 0x80000000;
            auVar223 = vpcmpgtq_avx(auVar234,auVar98);
            auVar205._0_8_ = auVar141._0_8_ ^ 0x8000000000000000;
            auVar205._8_4_ = auVar141._8_4_;
            auVar205._12_4_ = auVar141._12_4_ ^ 0x80000000;
            auVar233 = vpcmpgtq_avx(auVar205,auVar109);
            auVar223 = vpackssdw_avx(auVar233,auVar223);
            auVar235._0_8_ = auVar128._16_8_ ^ 0x8000000000000000;
            auVar235._8_4_ = auVar128._24_4_;
            auVar235._12_4_ = auVar128._28_4_ ^ 0x80000000;
            auVar233 = vpcmpgtq_avx(auVar235,auVar98);
            auVar224._0_8_ = auVar128._0_8_ ^ 0x8000000000000000;
            auVar224._8_4_ = auVar128._8_4_;
            auVar224._12_4_ = auVar128._12_4_ ^ 0x80000000;
            auVar261 = vpcmpgtq_avx(auVar224,auVar175);
            auVar233 = vpackssdw_avx(auVar261,auVar233);
            auVar223 = vpackssdw_avx(auVar233 ^ auVar20,auVar223 ^ auVar20);
            auVar233 = vpmovsxwd_avx(auVar223);
            auVar223 = vpunpckhwd_avx(auVar223,auVar223);
            auVar216._16_16_ = auVar223;
            auVar216._0_16_ = auVar233;
            auVar128 = vmaskmovps_avx(auVar216,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            auVar3._4_4_ = auVar128._4_4_ * auVar128._4_4_;
            auVar3._0_4_ = auVar128._0_4_ * auVar128._0_4_;
            auVar3._8_4_ = auVar128._8_4_ * auVar128._8_4_;
            auVar3._12_4_ = auVar128._12_4_ * auVar128._12_4_;
            auVar3._16_4_ = auVar128._16_4_ * auVar128._16_4_;
            auVar3._20_4_ = auVar128._20_4_ * auVar128._20_4_;
            auVar3._24_4_ = auVar128._24_4_ * auVar128._24_4_;
            auVar3._28_4_ = auVar128._28_4_;
            auVar128 = vmaskmovps_avx(auVar216,auVar3);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar128;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar7);
    }
    break;
  case 5:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar15 = 0;
      auVar52._8_4_ = 0xc0400000;
      auVar52._0_8_ = 0xc0400000c0400000;
      auVar52._12_4_ = 0xc0400000;
      auVar52._16_4_ = 0xc0400000;
      auVar52._20_4_ = 0xc0400000;
      auVar52._24_4_ = 0xc0400000;
      auVar52._28_4_ = 0xc0400000;
      auVar130._8_4_ = 0x7fffffff;
      auVar130._0_8_ = 0x7fffffff7fffffff;
      auVar130._12_4_ = 0x7fffffff;
      auVar130._16_4_ = 0x7fffffff;
      auVar130._20_4_ = 0x7fffffff;
      auVar130._24_4_ = 0x7fffffff;
      auVar130._28_4_ = 0x7fffffff;
      auVar143._8_4_ = 0x800000;
      auVar143._0_8_ = 0x80000000800000;
      auVar143._12_4_ = 0x800000;
      auVar143._16_4_ = 0x800000;
      auVar143._20_4_ = 0x800000;
      auVar143._24_4_ = 0x800000;
      auVar143._28_4_ = 0x800000;
      auVar212._8_4_ = 0x800000;
      auVar212._0_8_ = 0x80000000800000;
      auVar212._12_4_ = 0x800000;
      auVar266._8_8_ = 0x8000000000000000;
      auVar266._0_8_ = 0x8000000000000000;
      auVar20 = vpcmpeqd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_);
      do {
        auVar316._8_4_ = 0xc0400000;
        auVar316._0_8_ = 0xc0400000c0400000;
        auVar316._12_4_ = 0xc0400000;
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar128 = *pauVar16;
            auVar141 = vrsqrtps_avx(auVar128);
            auVar312._0_4_ = auVar128._0_4_ * auVar141._0_4_;
            auVar312._4_4_ = auVar128._4_4_ * auVar141._4_4_;
            auVar312._8_4_ = auVar128._8_4_ * auVar141._8_4_;
            auVar312._12_4_ = auVar128._12_4_ * auVar141._12_4_;
            auVar312._16_4_ = auVar128._16_4_ * auVar141._16_4_;
            auVar312._20_4_ = auVar128._20_4_ * auVar141._20_4_;
            auVar312._28_36_ = in_ZMM14._28_36_;
            auVar312._24_4_ = auVar128._24_4_ * auVar141._24_4_;
            auVar98 = vfmadd213ps_fma(auVar141,auVar312._0_32_,auVar52);
            in_ZMM14 = ZEXT3264(CONCAT428(in_ZMM14._28_4_,
                                          CONCAT424(auVar312._24_4_ * -0.5,
                                                    CONCAT420(auVar312._20_4_ * -0.5,
                                                              CONCAT416(auVar312._16_4_ * -0.5,
                                                                        CONCAT412(auVar312._12_4_ *
                                                                                  -0.5,CONCAT48(
                                                  auVar312._8_4_ * -0.5,
                                                  CONCAT44(auVar312._4_4_ * -0.5,
                                                           auVar312._0_4_ * -0.5))))))));
            auVar304._0_4_ = auVar312._0_4_ * -0.5 * auVar98._0_4_;
            auVar304._4_4_ = auVar312._4_4_ * -0.5 * auVar98._4_4_;
            auVar304._8_4_ = auVar312._8_4_ * -0.5 * auVar98._8_4_;
            auVar304._12_4_ = auVar312._12_4_ * -0.5 * auVar98._12_4_;
            auVar304._16_4_ = auVar312._16_4_ * -0.5 * 0.0;
            auVar304._20_4_ = auVar312._20_4_ * -0.5 * 0.0;
            auVar304._24_4_ = auVar312._24_4_ * -0.5 * 0.0;
            auVar304._28_4_ = 0;
            auVar128 = vandps_avx(auVar128,auVar130);
            auVar128 = vcmpps_avx(auVar143,auVar128,2);
            auVar128 = vandps_avx(auVar128,auVar304);
            *pauVar16 = auVar128;
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
            uVar8 = uVar18 & 0xfffffff8;
          } while (iVar13 < (int)uVar18);
        }
        auVar299._8_4_ = 0x7fffffff;
        auVar299._0_8_ = 0x7fffffff7fffffff;
        auVar299._12_4_ = 0x7fffffff;
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar98 = *(undefined1 (*) [16])*pauVar16;
          auVar109 = vrsqrtps_avx(auVar98);
          auVar193._0_4_ = auVar98._0_4_ * auVar109._0_4_;
          auVar193._4_4_ = auVar98._4_4_ * auVar109._4_4_;
          auVar193._8_4_ = auVar98._8_4_ * auVar109._8_4_;
          auVar193._12_4_ = auVar98._12_4_ * auVar109._12_4_;
          auVar109 = vfmadd213ps_fma(auVar109,auVar193,auVar316);
          in_ZMM6 = ZEXT1664(CONCAT412(auVar193._12_4_ * -0.5,
                                       CONCAT48(auVar193._8_4_ * -0.5,
                                                CONCAT44(auVar193._4_4_ * -0.5,auVar193._0_4_ * -0.5
                                                        ))));
          auVar179._0_4_ = auVar193._0_4_ * -0.5 * auVar109._0_4_;
          auVar179._4_4_ = auVar193._4_4_ * -0.5 * auVar109._4_4_;
          auVar179._8_4_ = auVar193._8_4_ * -0.5 * auVar109._8_4_;
          auVar179._12_4_ = auVar193._12_4_ * -0.5 * auVar109._12_4_;
          auVar98 = vandps_avx(auVar299,auVar98);
          auVar98 = vcmpps_avx(auVar212,auVar98,2);
          auVar98 = vandps_avx(auVar98,auVar179);
          *(undefined1 (*) [16])*pauVar16 = auVar98;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if ((int)uVar8 < (int)uVar18) {
          uVar9 = CONCAT44(0,~uVar8 + uVar18);
          auVar291._8_8_ = 0;
          auVar291._0_8_ = uVar9;
          auVar175 = vpshufd_avx(auVar291,0x44);
          auVar98 = vorps_avx(auVar175,auVar266);
          auVar109 = vorps_avx(auVar175,auVar266);
          auVar175 = vorps_avx(auVar175,auVar266);
          in_ZMM14 = ZEXT1664(auVar175);
          uVar14 = 0;
          do {
            auVar317._8_8_ = 0;
            auVar317._0_8_ = uVar14;
            auVar223 = vpshufd_avx(auVar317,0x44);
            auVar323._16_16_ = auVar223;
            auVar323._0_16_ = auVar223;
            auVar128 = vorps_avx(auVar323,auVar37);
            auVar141 = vorps_avx(auVar323,auVar47);
            auVar180._0_8_ = auVar141._16_8_ ^ 0x8000000000000000;
            auVar180._8_4_ = auVar141._24_4_;
            auVar180._12_4_ = auVar141._28_4_ ^ 0x80000000;
            auVar223 = vpcmpgtq_avx(auVar180,auVar98);
            auVar318._8_4_ = auVar141._8_4_;
            auVar318._0_8_ = auVar141._0_8_ ^ 0x8000000000000000;
            auVar318._12_4_ = auVar141._12_4_ ^ 0x80000000;
            auVar233 = vpcmpgtq_avx(auVar318,auVar109);
            auVar223 = vpackssdw_avx(auVar233,auVar223);
            auVar319._8_4_ = auVar128._24_4_;
            auVar319._0_8_ = auVar128._16_8_ ^ 0x8000000000000000;
            auVar319._12_4_ = auVar128._28_4_ ^ 0x80000000;
            auVar233 = vpcmpgtq_avx(auVar319,auVar98);
            auVar156._0_8_ = auVar128._0_8_ ^ 0x8000000000000000;
            auVar156._8_4_ = auVar128._8_4_;
            auVar156._12_4_ = auVar128._12_4_ ^ 0x80000000;
            auVar261 = vpcmpgtq_avx(auVar156,auVar175);
            auVar233 = vpackssdw_avx(auVar261,auVar233);
            auVar223 = vpackssdw_avx(auVar20 ^ auVar233,auVar20 ^ auVar223);
            auVar233 = vpmovsxwd_avx(auVar223);
            auVar223 = vpunpckhwd_avx(auVar223,auVar223);
            auVar168._16_16_ = auVar223;
            auVar168._0_16_ = auVar233;
            auVar141 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            auVar128 = vrsqrtps_avx(auVar141);
            auVar202._0_4_ = auVar128._0_4_ * auVar141._0_4_;
            auVar202._4_4_ = auVar128._4_4_ * auVar141._4_4_;
            auVar202._8_4_ = auVar128._8_4_ * auVar141._8_4_;
            auVar202._12_4_ = auVar128._12_4_ * auVar141._12_4_;
            auVar202._16_4_ = auVar128._16_4_ * auVar141._16_4_;
            auVar202._20_4_ = auVar128._20_4_ * auVar141._20_4_;
            auVar202._28_36_ = in_ZMM6._28_36_;
            auVar202._24_4_ = auVar128._24_4_ * auVar141._24_4_;
            auVar223 = vfmadd213ps_fma(auVar128,auVar202._0_32_,auVar52);
            auVar5._4_4_ = auVar223._4_4_ * auVar202._4_4_ * -0.5;
            auVar5._0_4_ = auVar223._0_4_ * auVar202._0_4_ * -0.5;
            auVar5._8_4_ = auVar223._8_4_ * auVar202._8_4_ * -0.5;
            auVar5._12_4_ = auVar223._12_4_ * auVar202._12_4_ * -0.5;
            auVar5._16_4_ = auVar202._16_4_ * -0.5 * 0.0;
            auVar5._20_4_ = auVar202._20_4_ * -0.5 * 0.0;
            auVar5._24_4_ = auVar202._24_4_ * -0.5 * 0.0;
            auVar5._28_4_ = in_ZMM6._28_4_;
            in_ZMM6 = ZEXT3264(auVar5);
            auVar128 = vandps_avx(auVar141,auVar130);
            auVar128 = vcmpps_avx(auVar143,auVar128,2);
            auVar128 = vandps_avx(auVar128,auVar5);
            auVar128 = vmaskmovps_avx(auVar168,auVar128);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar128;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar7);
    }
    break;
  case 6:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar15 = 0;
      auVar122._8_8_ = 0x8000000000000000;
      auVar122._0_8_ = 0x8000000000000000;
      auVar20 = vpcmpeqd_avx(auVar20,auVar20);
      auVar169._8_4_ = 0xc0400000;
      auVar169._0_8_ = 0xc0400000c0400000;
      auVar169._12_4_ = 0xc0400000;
      auVar169._16_4_ = 0xc0400000;
      auVar169._20_4_ = 0xc0400000;
      auVar169._24_4_ = 0xc0400000;
      auVar169._28_4_ = 0xc0400000;
      do {
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar128 = vrsqrtps_avx(*pauVar16);
            *pauVar16 = auVar128;
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
            uVar8 = uVar18 & 0xfffffff8;
          } while (iVar13 < (int)uVar18);
        }
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar98 = vrsqrtps_avx(*(undefined1 (*) [16])*pauVar16);
          *(undefined1 (*) [16])*pauVar16 = auVar98;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if ((int)uVar8 < (int)uVar18) {
          uVar9 = CONCAT44(0,~uVar8 + uVar18);
          auVar194._8_8_ = 0;
          auVar194._0_8_ = uVar9;
          auVar175 = vpshufd_avx(auVar194,0x44);
          auVar98 = vorps_avx(auVar175,auVar122);
          auVar109 = vorps_avx(auVar175,auVar122);
          auVar175 = vorps_avx(auVar175,auVar122);
          uVar14 = 0;
          do {
            auVar246._8_8_ = 0;
            auVar246._0_8_ = uVar14;
            auVar223 = vpshufd_avx(auVar246,0x44);
            auVar256._16_16_ = auVar223;
            auVar256._0_16_ = auVar223;
            auVar128 = vorps_avx(auVar256,auVar37);
            auVar141 = vorps_avx(auVar256,auVar47);
            auVar281._0_8_ = auVar141._16_8_ ^ 0x8000000000000000;
            auVar281._8_4_ = auVar141._24_4_;
            auVar281._12_4_ = auVar141._28_4_ ^ 0x80000000;
            auVar223 = vpcmpgtq_avx(auVar281,auVar98);
            auVar247._0_8_ = auVar141._0_8_ ^ 0x8000000000000000;
            auVar247._8_4_ = auVar141._8_4_;
            auVar247._12_4_ = auVar141._12_4_ ^ 0x80000000;
            auVar233 = vpcmpgtq_avx(auVar247,auVar109);
            auVar223 = vpackssdw_avx(auVar233,auVar223);
            auVar282._0_8_ = auVar128._16_8_ ^ 0x8000000000000000;
            auVar282._8_4_ = auVar128._24_4_;
            auVar282._12_4_ = auVar128._28_4_ ^ 0x80000000;
            auVar233 = vpcmpgtq_avx(auVar282,auVar98);
            auVar267._0_8_ = auVar128._0_8_ ^ 0x8000000000000000;
            auVar267._8_4_ = auVar128._8_4_;
            auVar267._12_4_ = auVar128._12_4_ ^ 0x80000000;
            auVar261 = vpcmpgtq_avx(auVar267,auVar175);
            auVar233 = vpackssdw_avx(auVar261,auVar233);
            auVar223 = vpackssdw_avx(auVar233 ^ auVar20,auVar223 ^ auVar20);
            auVar233 = vpmovsxwd_avx(auVar223);
            auVar223 = vpunpckhwd_avx(auVar223,auVar223);
            auVar257._16_16_ = auVar223;
            auVar257._0_16_ = auVar233;
            auVar141 = vmaskmovps_avx(auVar257,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            auVar128 = vrsqrtps_avx(auVar141);
            auVar6._4_4_ = auVar141._4_4_ * auVar128._4_4_;
            auVar6._0_4_ = auVar141._0_4_ * auVar128._0_4_;
            auVar6._8_4_ = auVar141._8_4_ * auVar128._8_4_;
            auVar6._12_4_ = auVar141._12_4_ * auVar128._12_4_;
            auVar6._16_4_ = auVar141._16_4_ * auVar128._16_4_;
            auVar6._20_4_ = auVar141._20_4_ * auVar128._20_4_;
            auVar6._24_4_ = auVar141._24_4_ * auVar128._24_4_;
            auVar6._28_4_ = auVar141._28_4_;
            auVar223 = vfmadd213ps_fma(auVar6,auVar128,auVar169);
            auVar272._0_4_ = auVar128._0_4_ * -0.5 * auVar223._0_4_;
            auVar272._4_4_ = auVar128._4_4_ * -0.5 * auVar223._4_4_;
            auVar272._8_4_ = auVar128._8_4_ * -0.5 * auVar223._8_4_;
            auVar272._12_4_ = auVar128._12_4_ * -0.5 * auVar223._12_4_;
            auVar272._16_4_ = auVar128._16_4_ * -0.5 * 0.0;
            auVar272._20_4_ = auVar128._20_4_ * -0.5 * 0.0;
            auVar272._24_4_ = auVar128._24_4_ * -0.5 * 0.0;
            auVar272._28_4_ = 0;
            auVar128 = vmaskmovps_avx(auVar257,auVar272);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar128;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar7);
    }
    break;
  case 7:
    local_128 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_128) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_110 = CONCAT44(local_110._4_4_,iVar7) & 0xfffffffffffffff8;
      lVar15 = 0;
      local_120._8_8_ = 0x8000000000000000;
      local_120._0_8_ = 0x8000000000000000;
      do {
        auVar322._8_4_ = 0x3e2aaaaa;
        auVar322._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar285._8_4_ = 0x395e8083;
        auVar285._0_8_ = 0x395e8083395e8083;
        auVar253._8_4_ = 0x3f318000;
        auVar253._0_8_ = 0x3f3180003f318000;
        auVar232._8_4_ = 0x3f800000;
        auVar232._0_8_ = 0x3f8000003f800000;
        auVar221._8_4_ = 0x3d2aa9c1;
        auVar221._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar199._8_4_ = 0x3f000000;
        auVar199._0_8_ = 0x3f0000003f000000;
        auVar184._8_4_ = 0x3c088908;
        auVar184._0_8_ = 0x3c0889083c088908;
        auVar166._8_4_ = 0x39506967;
        auVar166._0_8_ = 0x3950696739506967;
        auVar142._8_4_ = 0x3fb8aa3b;
        auVar142._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar129._8_4_ = 0xc2b0c0a5;
        auVar129._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar112._8_4_ = 0x42b0c0a5;
        auVar112._0_8_ = 0x42b0c0a542b0c0a5;
        auVar322._12_4_ = 0x3e2aaaaa;
        auVar285._12_4_ = 0x395e8083;
        auVar253._12_4_ = 0x3f318000;
        auVar232._12_4_ = 0x3f800000;
        auVar221._12_4_ = 0x3d2aa9c1;
        auVar199._12_4_ = 0x3f000000;
        auVar184._12_4_ = 0x3c088908;
        auVar166._12_4_ = 0x39506967;
        auVar142._12_4_ = 0x3fb8aa3b;
        auVar129._12_4_ = 0xc2b0c0a5;
        auVar112._12_4_ = 0x42b0c0a5;
        auVar322._16_4_ = 0x3e2aaaaa;
        auVar285._16_4_ = 0x395e8083;
        auVar253._16_4_ = 0x3f318000;
        auVar232._16_4_ = 0x3f800000;
        auVar221._16_4_ = 0x3d2aa9c1;
        auVar199._16_4_ = 0x3f000000;
        auVar184._16_4_ = 0x3c088908;
        auVar166._16_4_ = 0x39506967;
        auVar142._16_4_ = 0x3fb8aa3b;
        auVar129._16_4_ = 0xc2b0c0a5;
        auVar112._16_4_ = 0x42b0c0a5;
        auVar322._20_4_ = 0x3e2aaaaa;
        auVar285._20_4_ = 0x395e8083;
        auVar253._20_4_ = 0x3f318000;
        auVar232._20_4_ = 0x3f800000;
        auVar221._20_4_ = 0x3d2aa9c1;
        auVar199._20_4_ = 0x3f000000;
        auVar184._20_4_ = 0x3c088908;
        auVar166._20_4_ = 0x39506967;
        auVar142._20_4_ = 0x3fb8aa3b;
        auVar129._20_4_ = 0xc2b0c0a5;
        auVar112._20_4_ = 0x42b0c0a5;
        auVar322._24_4_ = 0x3e2aaaaa;
        auVar285._24_4_ = 0x395e8083;
        auVar253._24_4_ = 0x3f318000;
        auVar232._24_4_ = 0x3f800000;
        auVar221._24_4_ = 0x3d2aa9c1;
        auVar199._24_4_ = 0x3f000000;
        auVar184._24_4_ = 0x3c088908;
        auVar166._24_4_ = 0x39506967;
        auVar142._24_4_ = 0x3fb8aa3b;
        auVar129._24_4_ = 0xc2b0c0a5;
        auVar112._24_4_ = 0x42b0c0a5;
        auVar322._28_4_ = 0x3e2aaaaa;
        auVar285._28_4_ = 0x395e8083;
        auVar253._28_4_ = 0x3f318000;
        auVar232._28_4_ = 0x3f800000;
        auVar221._28_4_ = 0x3d2aa9c1;
        auVar199._28_4_ = 0x3f000000;
        auVar184._28_4_ = 0x3c088908;
        auVar166._28_4_ = 0x39506967;
        auVar142._28_4_ = 0x3fb8aa3b;
        auVar129._28_4_ = 0xc2b0c0a5;
        auVar112._28_4_ = 0x42b0c0a5;
        pauVar16 = (undefined1 (*) [32])
                   (local_108->cstep * lVar15 * local_108->elemsize + (long)local_108->data);
        if (iVar7 < 8) {
          uVar18 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar37 = vminps_avx(auVar112,*pauVar16);
            auVar47 = vmaxps_avx(auVar37,auVar129);
            auVar20 = vfmadd213ps_fma(auVar142,auVar47,auVar199);
            auVar128 = vroundps_avx(ZEXT1632(auVar20),1);
            auVar37 = vcmpps_avx(ZEXT1632(auVar20),auVar128,1);
            auVar37 = vandps_avx(auVar232,auVar37);
            auVar37 = vsubps_avx(auVar128,auVar37);
            auVar20 = vfmsub231ps_fma(auVar47,auVar37,auVar253);
            auVar98 = vfmsub231ps_fma(ZEXT1632(auVar20),auVar37,auVar285);
            auVar47 = ZEXT1632(auVar98);
            auVar4._28_4_ = auVar128._28_4_;
            auVar4._0_28_ =
                 ZEXT1628(CONCAT412(auVar98._12_4_ * auVar98._12_4_,
                                    CONCAT48(auVar98._8_4_ * auVar98._8_4_,
                                             CONCAT44(auVar98._4_4_ * auVar98._4_4_,
                                                      auVar98._0_4_ * auVar98._0_4_))));
            auVar167._8_4_ = 0x3ab743ce;
            auVar167._0_8_ = 0x3ab743ce3ab743ce;
            auVar167._12_4_ = 0x3ab743ce;
            auVar167._16_4_ = 0x3ab743ce;
            auVar167._20_4_ = 0x3ab743ce;
            auVar167._24_4_ = 0x3ab743ce;
            auVar167._28_4_ = 0x3ab743ce;
            auVar20 = vfmadd213ps_fma(auVar166,auVar47,auVar167);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar47,auVar184);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar47,auVar221);
            auVar47 = ZEXT1632(auVar98);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar47,auVar322);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar47,auVar199);
            auVar109 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar4,auVar47);
            auVar27._0_4_ = (int)auVar37._0_4_;
            auVar27._4_4_ = (int)auVar37._4_4_;
            auVar27._8_4_ = (int)auVar37._8_4_;
            auVar27._12_4_ = (int)auVar37._12_4_;
            auVar48._16_4_ = (int)auVar37._16_4_;
            auVar48._0_16_ = auVar27;
            auVar48._20_4_ = (int)auVar37._20_4_;
            auVar48._24_4_ = (int)auVar37._24_4_;
            auVar48._28_4_ = (int)auVar37._28_4_;
            auVar98 = vpslld_avx(auVar27,0x17);
            auVar20 = vpslld_avx(auVar48._16_16_,0x17);
            auVar153._8_4_ = 0x3f800000;
            auVar153._0_8_ = 0x3f8000003f800000;
            auVar153._12_4_ = 0x3f800000;
            auVar20 = vpaddd_avx(auVar20,auVar153);
            auVar98 = vpaddd_avx(auVar98,auVar153);
            auVar49._16_16_ = auVar20;
            auVar49._0_16_ = auVar98;
            auVar20 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar109),auVar49);
            *pauVar16 = ZEXT1632(auVar20);
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
          } while (iVar13 < iVar7);
          uVar18 = (uint)local_110;
        }
        auVar154._8_4_ = 0x3f800000;
        auVar154._0_8_ = 0x3f8000003f800000;
        auVar154._12_4_ = 0x3f800000;
        auVar178._8_4_ = 0x42b0c0a5;
        auVar178._0_8_ = 0x42b0c0a542b0c0a5;
        auVar178._12_4_ = 0x42b0c0a5;
        auVar190._8_4_ = 0xc2b0c0a5;
        auVar190._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar190._12_4_ = 0xc2b0c0a5;
        auVar211._8_4_ = 0x3fb8aa3b;
        auVar211._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar211._12_4_ = 0x3fb8aa3b;
        auVar227._8_4_ = 0x3f000000;
        auVar227._0_8_ = 0x3f0000003f000000;
        auVar227._12_4_ = 0x3f000000;
        auVar243._8_4_ = 0x3f318000;
        auVar243._0_8_ = 0x3f3180003f318000;
        auVar243._12_4_ = 0x3f318000;
        auVar264._8_4_ = 0x395e8083;
        auVar264._0_8_ = 0x395e8083395e8083;
        auVar264._12_4_ = 0x395e8083;
        auVar278._8_4_ = 0x3ab743ce;
        auVar278._0_8_ = 0x3ab743ce3ab743ce;
        auVar278._12_4_ = 0x3ab743ce;
        auVar290._8_4_ = 0x39506967;
        auVar290._0_8_ = 0x3950696739506967;
        auVar290._12_4_ = 0x39506967;
        auVar298._8_4_ = 0x3c088908;
        auVar298._0_8_ = 0x3c0889083c088908;
        auVar298._12_4_ = 0x3c088908;
        auVar308._8_4_ = 0x3d2aa9c1;
        auVar308._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar308._12_4_ = 0x3d2aa9c1;
        auVar315._8_4_ = 0x3e2aaaaa;
        auVar315._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar315._12_4_ = 0x3e2aaaaa;
        uVar8 = uVar18 | 3;
        while ((int)uVar8 < iVar7) {
          auVar20 = vminps_avx(auVar178,*(undefined1 (*) [16])*pauVar16);
          auVar109 = vmaxps_avx(auVar20,auVar190);
          auVar20 = vfmadd213ps_fma(auVar211,auVar109,auVar227);
          auVar120._0_4_ = (int)auVar20._0_4_;
          auVar120._4_4_ = (int)auVar20._4_4_;
          auVar120._8_4_ = (int)auVar20._8_4_;
          auVar120._12_4_ = (int)auVar20._12_4_;
          auVar98 = vcvtdq2ps_avx(auVar120);
          auVar20 = vcmpps_avx(auVar20,auVar98,1);
          auVar20 = vandps_avx(auVar20,auVar154);
          auVar20 = vsubps_avx(auVar98,auVar20);
          auVar98 = vfmsub231ps_fma(auVar109,auVar20,auVar243);
          auVar109 = vfmsub231ps_fma(auVar98,auVar20,auVar264);
          auVar121._0_4_ = auVar109._0_4_ * auVar109._0_4_;
          auVar121._4_4_ = auVar109._4_4_ * auVar109._4_4_;
          auVar121._8_4_ = auVar109._8_4_ * auVar109._8_4_;
          auVar121._12_4_ = auVar109._12_4_ * auVar109._12_4_;
          auVar98 = vfmadd213ps_fma(auVar290,auVar109,auVar278);
          auVar98 = vfmadd213ps_fma(auVar98,auVar109,auVar298);
          auVar98 = vfmadd213ps_fma(auVar98,auVar109,auVar308);
          auVar98 = vfmadd213ps_fma(auVar98,auVar109,auVar315);
          auVar98 = vfmadd213ps_fma(auVar98,auVar109,auVar227);
          auVar98 = vfmadd213ps_fma(auVar98,auVar121,auVar109);
          auVar28._0_4_ = (int)auVar20._0_4_;
          auVar28._4_4_ = (int)auVar20._4_4_;
          auVar28._8_4_ = (int)auVar20._8_4_;
          auVar28._12_4_ = (int)auVar20._12_4_;
          auVar20 = vpslld_avx(auVar28,0x17);
          auVar20 = vpaddd_avx(auVar20,auVar154);
          auVar20 = vfmadd213ps_fma(auVar20,auVar98,auVar20);
          *(undefined1 (*) [16])*pauVar16 = auVar20;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar8 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        auVar20 = vpcmpeqd_avx(auVar178,auVar178);
        if ((int)uVar18 < iVar7) {
          uVar9 = CONCAT44(0,~uVar18 + iVar7);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = uVar9;
          local_a0._0_16_ = vpshufd_avx(auVar29,0x44);
          local_d0 = vorps_avx(local_a0._0_16_,local_120);
          local_e0 = vorps_avx(local_a0._0_16_,local_120);
          uVar14 = 0;
          auVar37 = _DAT_00512ca0;
          local_a0._16_16_ = local_a0._0_16_;
          do {
            auVar30._8_8_ = 0;
            auVar30._0_8_ = uVar14;
            auVar98 = vpshufd_avx(auVar30,0x44);
            auVar50._16_16_ = auVar98;
            auVar50._0_16_ = auVar98;
            auVar47 = vorps_avx(auVar50,_DAT_00512c80);
            auVar37 = vorps_avx(auVar50,auVar37);
            auVar175 = vpor_avx(local_a0._16_16_,local_120);
            auVar98 = vpcmpgtq_avx(auVar37._16_16_ ^ local_120,auVar175);
            auVar109 = vpcmpgtq_avx(auVar37._0_16_ ^ local_120,local_d0);
            auVar98 = vpackssdw_avx(auVar109,auVar98);
            auVar109 = vpcmpgtq_avx(auVar47._16_16_ ^ local_120,auVar175);
            auVar107._0_4_ = auVar47._0_4_ ^ local_120._0_4_;
            auVar107._4_4_ = auVar47._4_4_ ^ local_120._4_4_;
            auVar107._8_4_ = auVar47._8_4_ ^ local_120._8_4_;
            auVar107._12_4_ = auVar47._12_4_ ^ local_120._12_4_;
            auVar175 = vpcmpgtq_avx(auVar107,local_e0);
            auVar109 = vpackssdw_avx(auVar175,auVar109);
            auVar98 = vpackssdw_avx(auVar109 ^ auVar20,auVar98 ^ auVar20);
            auVar109 = vpmovsxwd_avx(auVar98);
            auVar98 = vpunpckhwd_avx(auVar98,auVar98);
            local_c0._16_16_ = auVar98;
            local_c0._0_16_ = auVar109;
            local_100 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            _local_140 = local_100._16_16_;
            local_150._0_4_ = expf(local_100._16_4_);
            local_150._4_4_ = extraout_XMM0_Db_23;
            local_150._8_4_ = extraout_XMM0_Dc_23;
            local_150._12_4_ = extraout_XMM0_Dd_23;
            auVar98 = vmovshdup_avx(_local_140);
            auVar76._0_4_ = expf(auVar98._0_4_);
            auVar76._4_60_ = extraout_var_15;
            local_150 = vinsertps_avx(local_150,auVar76._0_16_,0x10);
            auVar98 = vpermilpd_avx(_local_140,1);
            auVar77._0_4_ = expf(auVar98._0_4_);
            auVar77._4_60_ = extraout_var_16;
            local_150 = vinsertps_avx(local_150,auVar77._0_16_,0x20);
            auVar98 = vpermilps_avx(_local_140,0xff);
            auVar78._0_4_ = expf(auVar98._0_4_);
            auVar78._4_60_ = extraout_var_17;
            _local_140 = vinsertps_avx(local_150,auVar78._0_16_,0x30);
            local_150._0_4_ = expf((float)local_100._0_4_);
            local_150._4_4_ = extraout_XMM0_Db_24;
            local_150._8_4_ = extraout_XMM0_Dc_24;
            local_150._12_4_ = extraout_XMM0_Dd_24;
            auVar98 = vmovshdup_avx(local_100._0_16_);
            auVar79._0_4_ = expf(auVar98._0_4_);
            auVar79._4_60_ = extraout_var_18;
            local_150 = vinsertps_avx(local_150,auVar79._0_16_,0x10);
            auVar98 = vpermilpd_avx(local_100._0_16_,1);
            auVar80._0_4_ = expf(auVar98._0_4_);
            auVar80._4_60_ = extraout_var_19;
            local_150 = vinsertps_avx(local_150,auVar80._0_16_,0x20);
            auVar98 = vpermilps_avx(local_100._0_16_,0xff);
            auVar81._0_4_ = expf(auVar98._0_4_);
            auVar37 = _DAT_00512ca0;
            auVar81._4_60_ = extraout_var_20;
            auVar20 = vpcmpeqd_avx(auVar20,auVar20);
            auVar98 = vinsertps_avx(local_150,auVar81._0_16_,0x30);
            auVar51._16_16_ = _local_140;
            auVar51._0_16_ = auVar98;
            auVar47 = vmaskmovps_avx(local_c0,auVar51);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar47;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != local_128);
    }
    break;
  case 8:
    local_128 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_128) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_110 = CONCAT44(local_110._4_4_,iVar7) & 0xfffffffffffffff8;
      lVar15 = 0;
      local_120._8_8_ = 0x8000000000000000;
      local_120._0_8_ = 0x8000000000000000;
      do {
        auVar324._8_4_ = 0x3e11e9bf;
        auVar324._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar311._8_4_ = 0xbdfe5d4f;
        auVar311._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar305._8_4_ = 0x3def251a;
        auVar305._0_8_ = 0x3def251a3def251a;
        auVar295._8_4_ = 0x3d9021bb;
        auVar295._0_8_ = 0x3d9021bb3d9021bb;
        auVar286._8_4_ = 0xbdebd1b8;
        auVar286._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar258._8_4_ = 0x3f3504f3;
        auVar258._0_8_ = 0x3f3504f33f3504f3;
        auVar222._8_4_ = 0x3f000000;
        auVar222._0_8_ = 0x3f0000003f000000;
        auVar201._8_4_ = 0x807fffff;
        auVar201._0_8_ = 0x807fffff807fffff;
        auVar185._8_4_ = 0x800000;
        auVar185._0_8_ = 0x80000000800000;
        auVar324._12_4_ = 0x3e11e9bf;
        auVar311._12_4_ = 0xbdfe5d4f;
        auVar305._12_4_ = 0x3def251a;
        auVar295._12_4_ = 0x3d9021bb;
        auVar286._12_4_ = 0xbdebd1b8;
        auVar258._12_4_ = 0x3f3504f3;
        auVar222._12_4_ = 0x3f000000;
        auVar201._12_4_ = 0x807fffff;
        auVar185._12_4_ = 0x800000;
        auVar324._16_4_ = 0x3e11e9bf;
        auVar311._16_4_ = 0xbdfe5d4f;
        auVar305._16_4_ = 0x3def251a;
        auVar295._16_4_ = 0x3d9021bb;
        auVar286._16_4_ = 0xbdebd1b8;
        auVar258._16_4_ = 0x3f3504f3;
        auVar222._16_4_ = 0x3f000000;
        auVar201._16_4_ = 0x807fffff;
        auVar185._16_4_ = 0x800000;
        auVar324._20_4_ = 0x3e11e9bf;
        auVar311._20_4_ = 0xbdfe5d4f;
        auVar305._20_4_ = 0x3def251a;
        auVar295._20_4_ = 0x3d9021bb;
        auVar286._20_4_ = 0xbdebd1b8;
        auVar258._20_4_ = 0x3f3504f3;
        auVar222._20_4_ = 0x3f000000;
        auVar201._20_4_ = 0x807fffff;
        auVar185._20_4_ = 0x800000;
        auVar229._8_4_ = 0xffffff81;
        auVar229._0_8_ = 0xffffff81ffffff81;
        auVar324._24_4_ = 0x3e11e9bf;
        auVar311._24_4_ = 0xbdfe5d4f;
        auVar305._24_4_ = 0x3def251a;
        auVar295._24_4_ = 0x3d9021bb;
        auVar286._24_4_ = 0xbdebd1b8;
        auVar258._24_4_ = 0x3f3504f3;
        auVar222._24_4_ = 0x3f000000;
        auVar201._24_4_ = 0x807fffff;
        auVar185._24_4_ = 0x800000;
        auVar324._28_4_ = 0x3e11e9bf;
        auVar311._28_4_ = 0xbdfe5d4f;
        auVar305._28_4_ = 0x3def251a;
        auVar295._28_4_ = 0x3d9021bb;
        auVar286._28_4_ = 0xbdebd1b8;
        auVar258._28_4_ = 0x3f3504f3;
        auVar229._12_4_ = 0xffffff81;
        auVar222._28_4_ = 0x3f000000;
        auVar201._28_4_ = 0x807fffff;
        auVar185._28_4_ = 0x800000;
        pauVar16 = (undefined1 (*) [32])
                   (local_108->cstep * lVar15 * local_108->elemsize + (long)local_108->data);
        if (iVar7 < 8) {
          uVar18 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar37 = vmaxps_avx(auVar185,*pauVar16);
            auVar98 = vpsrld_avx(auVar37._0_16_,0x17);
            auVar20 = vpsrld_avx(auVar37._16_16_,0x17);
            auVar37 = vandps_avx(auVar37,auVar201);
            auVar128 = vorps_avx(auVar37,auVar222);
            auVar47 = vcmpps_avx(auVar258,auVar128,2);
            auVar37 = vandnps_avx(auVar47,auVar128);
            auVar55._0_4_ = auVar128._0_4_ + -1.0 + auVar37._0_4_;
            auVar55._4_4_ = auVar128._4_4_ + -1.0 + auVar37._4_4_;
            auVar55._8_4_ = auVar128._8_4_ + -1.0 + auVar37._8_4_;
            auVar55._12_4_ = auVar128._12_4_ + -1.0 + auVar37._12_4_;
            auVar55._16_4_ = auVar128._16_4_ + -1.0 + auVar37._16_4_;
            auVar55._20_4_ = auVar128._20_4_ + -1.0 + auVar37._20_4_;
            auVar55._24_4_ = auVar128._24_4_ + -1.0 + auVar37._24_4_;
            auVar55._28_4_ = auVar128._28_4_ + -1.0 + auVar37._28_4_;
            auVar20 = vpsubd_avx(auVar20,auVar47._16_16_);
            auVar20 = vpaddd_avx(auVar229,auVar20);
            auVar98 = vpsubd_avx(auVar98,auVar47._0_16_);
            auVar98 = vpaddd_avx(auVar229,auVar98);
            auVar113._16_16_ = auVar20;
            auVar113._0_16_ = auVar98;
            auVar131._0_4_ = auVar55._0_4_ * auVar55._0_4_;
            auVar131._4_4_ = auVar55._4_4_ * auVar55._4_4_;
            auVar131._8_4_ = auVar55._8_4_ * auVar55._8_4_;
            auVar131._12_4_ = auVar55._12_4_ * auVar55._12_4_;
            auVar131._16_4_ = auVar55._16_4_ * auVar55._16_4_;
            auVar131._20_4_ = auVar55._20_4_ * auVar55._20_4_;
            auVar131._24_4_ = auVar55._24_4_ * auVar55._24_4_;
            auVar131._28_4_ = 0;
            auVar20 = vfmadd213ps_fma(auVar295,auVar55,auVar286);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar55,auVar305);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar55,auVar311);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar55,auVar324);
            auVar170._8_4_ = 0xbe2aae50;
            auVar170._0_8_ = 0xbe2aae50be2aae50;
            auVar170._12_4_ = 0xbe2aae50;
            auVar170._16_4_ = 0xbe2aae50;
            auVar170._20_4_ = 0xbe2aae50;
            auVar170._24_4_ = 0xbe2aae50;
            auVar170._28_4_ = 0xbe2aae50;
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar55,auVar170);
            auVar171._8_4_ = 0x3e4cceac;
            auVar171._0_8_ = 0x3e4cceac3e4cceac;
            auVar171._12_4_ = 0x3e4cceac;
            auVar171._16_4_ = 0x3e4cceac;
            auVar171._20_4_ = 0x3e4cceac;
            auVar171._24_4_ = 0x3e4cceac;
            auVar171._28_4_ = 0x3e4cceac;
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar55,auVar171);
            auVar172._8_4_ = 0xbe7ffffc;
            auVar172._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar172._12_4_ = 0xbe7ffffc;
            auVar172._16_4_ = 0xbe7ffffc;
            auVar172._20_4_ = 0xbe7ffffc;
            auVar172._24_4_ = 0xbe7ffffc;
            auVar172._28_4_ = 0xbe7ffffc;
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar55,auVar172);
            auVar173._8_4_ = 0x3eaaaaaa;
            auVar173._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar173._12_4_ = 0x3eaaaaaa;
            auVar173._16_4_ = 0x3eaaaaaa;
            auVar173._20_4_ = 0x3eaaaaaa;
            auVar173._24_4_ = 0x3eaaaaaa;
            auVar173._28_4_ = 0x3eaaaaaa;
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar55,auVar173);
            auVar144._0_4_ = auVar131._0_4_ * auVar55._0_4_ * auVar20._0_4_;
            auVar144._4_4_ = auVar131._4_4_ * auVar55._4_4_ * auVar20._4_4_;
            auVar144._8_4_ = auVar131._8_4_ * auVar55._8_4_ * auVar20._8_4_;
            auVar144._12_4_ = auVar131._12_4_ * auVar55._12_4_ * auVar20._12_4_;
            auVar144._16_4_ = auVar131._16_4_ * auVar55._16_4_ * 0.0;
            auVar144._20_4_ = auVar131._20_4_ * auVar55._20_4_ * 0.0;
            auVar144._24_4_ = auVar131._24_4_ * auVar55._24_4_ * 0.0;
            auVar144._28_4_ = 0;
            auVar37 = vcvtdq2ps_avx(auVar113);
            auVar174._8_4_ = 0xb95e8083;
            auVar174._0_8_ = 0xb95e8083b95e8083;
            auVar174._12_4_ = 0xb95e8083;
            auVar174._16_4_ = 0xb95e8083;
            auVar174._20_4_ = 0xb95e8083;
            auVar174._24_4_ = 0xb95e8083;
            auVar174._28_4_ = 0xb95e8083;
            auVar20 = vfmadd231ps_fma(auVar144,auVar37,auVar174);
            auVar20 = vfmsub231ps_fma(ZEXT1632(auVar20),auVar222,auVar131);
            auVar47 = vsubps_avx(ZEXT1632(auVar20),auVar55);
            auVar132._8_4_ = 0x3f318000;
            auVar132._0_8_ = 0x3f3180003f318000;
            auVar132._12_4_ = 0x3f318000;
            auVar132._16_4_ = 0x3f318000;
            auVar132._20_4_ = 0x3f318000;
            auVar132._24_4_ = 0x3f318000;
            auVar132._28_4_ = 0x3f318000;
            auVar20 = vfmsub231ps_fma(auVar47,auVar132,auVar37);
            *pauVar16 = ZEXT1632(auVar20);
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
          } while (iVar13 < iVar7);
          uVar18 = (uint)local_110;
        }
        auVar182._8_4_ = 0x800000;
        auVar182._0_8_ = 0x80000000800000;
        auVar182._12_4_ = 0x800000;
        auVar213._8_4_ = 0x3f000000;
        auVar213._0_8_ = 0x3f0000003f000000;
        auVar213._12_4_ = 0x3f000000;
        auVar230._8_4_ = 0xffffff82;
        auVar230._0_8_ = 0xffffff82ffffff82;
        auVar230._12_4_ = 0xffffff82;
        auVar249._8_4_ = 0x3f3504f3;
        auVar249._0_8_ = 0x3f3504f33f3504f3;
        auVar249._12_4_ = 0x3f3504f3;
        auVar284._8_4_ = 0x3f800000;
        auVar284._0_8_ = 0x3f8000003f800000;
        auVar284._12_4_ = 0x3f800000;
        auVar293._8_4_ = 0xbdebd1b8;
        auVar293._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar293._12_4_ = 0xbdebd1b8;
        auVar301._8_4_ = 0x3d9021bb;
        auVar301._0_8_ = 0x3d9021bb3d9021bb;
        auVar301._12_4_ = 0x3d9021bb;
        auVar310._8_4_ = 0x3def251a;
        auVar310._0_8_ = 0x3def251a3def251a;
        auVar310._12_4_ = 0x3def251a;
        auVar321._8_4_ = 0xbdfe5d4f;
        auVar321._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar321._12_4_ = 0xbdfe5d4f;
        auVar196._8_4_ = 0x3e11e9bf;
        auVar196._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar196._12_4_ = 0x3e11e9bf;
        uVar8 = uVar18 | 3;
        while ((int)uVar8 < iVar7) {
          auVar20 = vmaxps_avx(auVar182,*(undefined1 (*) [16])*pauVar16);
          auVar98 = vpsrld_avx(auVar20,0x17);
          auVar98 = vpaddd_avx(auVar230,auVar98);
          auVar125._8_4_ = 0x807fffff;
          auVar125._0_8_ = 0x807fffff807fffff;
          auVar125._12_4_ = 0x807fffff;
          auVar20 = vandps_avx(auVar20,auVar125);
          auVar175 = vorps_avx(auVar20,auVar213);
          auVar109 = vcvtdq2ps_avx(auVar98);
          auVar98 = vcmpps_avx(auVar175,auVar249,1);
          auVar20 = vandps_avx(auVar98,auVar175);
          auVar34._0_4_ = auVar175._0_4_ + -1.0 + auVar20._0_4_;
          auVar34._4_4_ = auVar175._4_4_ + -1.0 + auVar20._4_4_;
          auVar34._8_4_ = auVar175._8_4_ + -1.0 + auVar20._8_4_;
          auVar34._12_4_ = auVar175._12_4_ + -1.0 + auVar20._12_4_;
          auVar20 = vandps_avx(auVar284,auVar98);
          auVar20 = vsubps_avx(auVar109,auVar20);
          auVar126._0_4_ = auVar34._0_4_ * auVar34._0_4_;
          auVar126._4_4_ = auVar34._4_4_ * auVar34._4_4_;
          auVar126._8_4_ = auVar34._8_4_ * auVar34._8_4_;
          auVar126._12_4_ = auVar34._12_4_ * auVar34._12_4_;
          auVar98 = vfmadd213ps_fma(auVar301,auVar34,auVar293);
          auVar98 = vfmadd213ps_fma(auVar98,auVar34,auVar310);
          auVar98 = vfmadd213ps_fma(auVar98,auVar34,auVar321);
          auVar98 = vfmadd213ps_fma(auVar98,auVar34,auVar196);
          auVar160._8_4_ = 0xbe2aae50;
          auVar160._0_8_ = 0xbe2aae50be2aae50;
          auVar160._12_4_ = 0xbe2aae50;
          auVar98 = vfmadd213ps_fma(auVar98,auVar34,auVar160);
          auVar161._8_4_ = 0x3e4cceac;
          auVar161._0_8_ = 0x3e4cceac3e4cceac;
          auVar161._12_4_ = 0x3e4cceac;
          auVar98 = vfmadd213ps_fma(auVar98,auVar34,auVar161);
          auVar162._8_4_ = 0xbe7ffffc;
          auVar162._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar162._12_4_ = 0xbe7ffffc;
          auVar98 = vfmadd213ps_fma(auVar98,auVar34,auVar162);
          auVar163._8_4_ = 0x3eaaaaaa;
          auVar163._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar163._12_4_ = 0x3eaaaaaa;
          auVar98 = vfmadd213ps_fma(auVar98,auVar34,auVar163);
          auVar140._0_4_ = auVar126._0_4_ * auVar34._0_4_ * auVar98._0_4_;
          auVar140._4_4_ = auVar126._4_4_ * auVar34._4_4_ * auVar98._4_4_;
          auVar140._8_4_ = auVar126._8_4_ * auVar34._8_4_ * auVar98._8_4_;
          auVar140._12_4_ = auVar126._12_4_ * auVar34._12_4_ * auVar98._12_4_;
          auVar164._8_4_ = 0xb95e8083;
          auVar164._0_8_ = 0xb95e8083b95e8083;
          auVar164._12_4_ = 0xb95e8083;
          auVar98 = vfmadd231ps_fma(auVar140,auVar20,auVar164);
          auVar98 = vfmsub231ps_fma(auVar98,auVar213,auVar126);
          auVar98 = vsubps_avx(auVar98,auVar34);
          auVar127._8_4_ = 0x3f318000;
          auVar127._0_8_ = 0x3f3180003f318000;
          auVar127._12_4_ = 0x3f318000;
          auVar20 = vfmsub231ps_fma(auVar98,auVar127,auVar20);
          *(undefined1 (*) [16])*pauVar16 = auVar20;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar8 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        auVar20 = vpcmpeqd_avx(auVar182,auVar182);
        if ((int)uVar18 < iVar7) {
          uVar9 = CONCAT44(0,~uVar18 + iVar7);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = uVar9;
          local_a0._0_16_ = vpshufd_avx(auVar35,0x44);
          local_d0 = vpor_avx(local_a0._0_16_,local_120);
          local_e0 = vpor_avx(local_a0._0_16_,local_120);
          uVar14 = 0;
          auVar37 = _DAT_00512ca0;
          local_a0._16_16_ = local_a0._0_16_;
          do {
            auVar36._8_8_ = 0;
            auVar36._0_8_ = uVar14;
            auVar98 = vpshufd_avx(auVar36,0x44);
            auVar56._16_16_ = auVar98;
            auVar56._0_16_ = auVar98;
            auVar47 = vorps_avx(auVar56,_DAT_00512c80);
            auVar37 = vorps_avx(auVar56,auVar37);
            auVar175 = vpor_avx(local_a0._16_16_,local_120);
            auVar98 = vpcmpgtq_avx(auVar37._16_16_ ^ local_120,auVar175);
            auVar109 = vpcmpgtq_avx(auVar37._0_16_ ^ local_120,local_d0);
            auVar98 = vpackssdw_avx(auVar109,auVar98);
            auVar109 = vpcmpgtq_avx(auVar47._16_16_ ^ local_120,auVar175);
            auVar111._0_4_ = auVar47._0_4_ ^ local_120._0_4_;
            auVar111._4_4_ = auVar47._4_4_ ^ local_120._4_4_;
            auVar111._8_4_ = auVar47._8_4_ ^ local_120._8_4_;
            auVar111._12_4_ = auVar47._12_4_ ^ local_120._12_4_;
            auVar175 = vpcmpgtq_avx(auVar111,local_e0);
            auVar109 = vpackssdw_avx(auVar175,auVar109);
            auVar98 = vpackssdw_avx(auVar109 ^ auVar20,auVar98 ^ auVar20);
            auVar109 = vpmovsxwd_avx(auVar98);
            auVar98 = vpunpckhwd_avx(auVar98,auVar98);
            local_c0._16_16_ = auVar98;
            local_c0._0_16_ = auVar109;
            local_100 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            _local_140 = local_100._16_16_;
            local_150._0_4_ = logf(local_100._16_4_);
            local_150._4_4_ = extraout_XMM0_Db_37;
            local_150._8_4_ = extraout_XMM0_Dc_37;
            local_150._12_4_ = extraout_XMM0_Dd_37;
            auVar98 = vmovshdup_avx(_local_140);
            auVar90._0_4_ = logf(auVar98._0_4_);
            auVar90._4_60_ = extraout_var_29;
            local_150 = vinsertps_avx(local_150,auVar90._0_16_,0x10);
            auVar98 = vpermilpd_avx(_local_140,1);
            auVar91._0_4_ = logf(auVar98._0_4_);
            auVar91._4_60_ = extraout_var_30;
            local_150 = vinsertps_avx(local_150,auVar91._0_16_,0x20);
            auVar98 = vpermilps_avx(_local_140,0xff);
            auVar92._0_4_ = logf(auVar98._0_4_);
            auVar92._4_60_ = extraout_var_31;
            _local_140 = vinsertps_avx(local_150,auVar92._0_16_,0x30);
            local_150._0_4_ = logf((float)local_100._0_4_);
            local_150._4_4_ = extraout_XMM0_Db_38;
            local_150._8_4_ = extraout_XMM0_Dc_38;
            local_150._12_4_ = extraout_XMM0_Dd_38;
            auVar98 = vmovshdup_avx(local_100._0_16_);
            auVar93._0_4_ = logf(auVar98._0_4_);
            auVar93._4_60_ = extraout_var_32;
            local_150 = vinsertps_avx(local_150,auVar93._0_16_,0x10);
            auVar98 = vpermilpd_avx(local_100._0_16_,1);
            auVar94._0_4_ = logf(auVar98._0_4_);
            auVar94._4_60_ = extraout_var_33;
            local_150 = vinsertps_avx(local_150,auVar94._0_16_,0x20);
            auVar98 = vpermilps_avx(local_100._0_16_,0xff);
            auVar95._0_4_ = logf(auVar98._0_4_);
            auVar37 = _DAT_00512ca0;
            auVar95._4_60_ = extraout_var_34;
            auVar20 = vpcmpeqd_avx(auVar20,auVar20);
            auVar98 = vinsertps_avx(local_150,auVar95._0_16_,0x30);
            auVar57._16_16_ = _local_140;
            auVar57._0_16_ = auVar98;
            auVar47 = vmaskmovps_avx(local_c0,auVar57);
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar47;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != local_128);
    }
    break;
  case 9:
    local_110 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_110) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_128 = 0;
      local_120._8_8_ = 0x8000000000000000;
      local_120._0_8_ = 0x8000000000000000;
      do {
        auVar20 = in_ZMM8._0_16_;
        pfVar12 = (float *)(local_108->cstep * local_128 * local_108->elemsize +
                           (long)local_108->data);
        if (iVar7 < 8) {
          uVar18 = 0;
        }
        else {
          uVar8 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar12;
            afVar41 = (__m256)local_80;
            UnaryOp_x86_fma_functor::unary_op_sin::func_pack8
                      ((unary_op_sin *)&local_151,(__m256 *)local_80);
            auVar20 = in_ZMM8._0_16_;
            *(__m256 *)pfVar12 = afVar41;
            pfVar12 = pfVar12 + 8;
            uVar18 = uVar8 + 8;
            iVar13 = uVar8 + 0xf;
            uVar8 = uVar18;
          } while (iVar13 < iVar7);
        }
        uVar8 = uVar18 | 3;
        auVar20 = vpcmpeqd_avx(auVar20,auVar20);
        in_ZMM8 = ZEXT1664(auVar20);
        auVar262._8_4_ = 2;
        auVar262._0_8_ = 0x200000002;
        auVar262._12_4_ = 2;
        auVar297._8_4_ = 0xbf490000;
        auVar297._0_8_ = 0xbf490000bf490000;
        auVar297._12_4_ = 0xbf490000;
        auVar307._8_4_ = 0xb97da000;
        auVar307._0_8_ = 0xb97da000b97da000;
        auVar307._12_4_ = 0xb97da000;
        auVar314._8_4_ = 0xb3222169;
        auVar314._0_8_ = 0xb3222169b3222169;
        auVar314._12_4_ = 0xb3222169;
        auVar206._8_4_ = 0x37ccf5ce;
        auVar206._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar206._12_4_ = 0x37ccf5ce;
        auVar275._8_4_ = 0x3d2aaaa5;
        auVar275._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar275._12_4_ = 0x3d2aaaa5;
        auVar236._8_4_ = 0x3f000000;
        auVar236._0_8_ = 0x3f0000003f000000;
        auVar236._12_4_ = 0x3f000000;
        while ((int)uVar8 < iVar7) {
          auVar102._8_4_ = 0x7fffffff;
          auVar102._0_8_ = 0x7fffffff7fffffff;
          auVar102._12_4_ = 0x7fffffff;
          auVar98 = vandps_avx(*(undefined1 (*) [16])pfVar12,auVar102);
          auVar103._0_4_ = (int)(auVar98._0_4_ * 1.2732395);
          auVar103._4_4_ = (int)(auVar98._4_4_ * 1.2732395);
          auVar103._8_4_ = (int)(auVar98._8_4_ * 1.2732395);
          auVar103._12_4_ = (int)(auVar98._12_4_ * 1.2732395);
          auVar175 = vpsubd_avx(auVar103,auVar20);
          auVar134._8_4_ = 0xfffffffe;
          auVar134._0_8_ = 0xfffffffefffffffe;
          auVar134._12_4_ = 0xfffffffe;
          auVar109 = vpand_avx(auVar175,auVar134);
          auVar109 = vcvtdq2ps_avx(auVar109);
          auVar98 = vfmadd231ps_fma(auVar98,auVar109,auVar297);
          auVar98 = vfmadd231ps_fma(auVar98,auVar109,auVar307);
          auVar109 = vfmadd231ps_fma(auVar98,auVar314,auVar109);
          auVar135._0_4_ = auVar109._0_4_ * auVar109._0_4_;
          auVar135._4_4_ = auVar109._4_4_ * auVar109._4_4_;
          auVar135._8_4_ = auVar109._8_4_ * auVar109._8_4_;
          auVar135._12_4_ = auVar109._12_4_ * auVar109._12_4_;
          auVar176._8_4_ = 0xbab6061a;
          auVar176._0_8_ = 0xbab6061abab6061a;
          auVar176._12_4_ = 0xbab6061a;
          auVar98 = vfmadd213ps_fma(auVar206,auVar135,auVar176);
          auVar98 = vfmadd213ps_fma(auVar98,auVar135,auVar275);
          auVar148._0_4_ = auVar135._0_4_ * auVar135._0_4_ * auVar98._0_4_;
          auVar148._4_4_ = auVar135._4_4_ * auVar135._4_4_ * auVar98._4_4_;
          auVar148._8_4_ = auVar135._8_4_ * auVar135._8_4_ * auVar98._8_4_;
          auVar148._12_4_ = auVar135._12_4_ * auVar135._12_4_ * auVar98._12_4_;
          auVar223 = vfnmadd231ps_fma(auVar148,auVar135,auVar236);
          auVar177._8_4_ = 0xb94ca1f9;
          auVar177._0_8_ = 0xb94ca1f9b94ca1f9;
          auVar177._12_4_ = 0xb94ca1f9;
          auVar187._8_4_ = 0x3c08839e;
          auVar187._0_8_ = 0x3c08839e3c08839e;
          auVar187._12_4_ = 0x3c08839e;
          auVar98 = vfmadd213ps_fma(auVar177,auVar135,auVar187);
          auVar188._8_4_ = 0xbe2aaaa3;
          auVar188._0_8_ = 0xbe2aaaa3be2aaaa3;
          auVar188._12_4_ = 0xbe2aaaa3;
          auVar98 = vfmadd213ps_fma(auVar98,auVar135,auVar188);
          auVar136._0_4_ = auVar98._0_4_ * auVar135._0_4_;
          auVar136._4_4_ = auVar98._4_4_ * auVar135._4_4_;
          auVar136._8_4_ = auVar98._8_4_ * auVar135._8_4_;
          auVar136._12_4_ = auVar98._12_4_ * auVar135._12_4_;
          auVar109 = vfmadd213ps_fma(auVar136,auVar109,auVar109);
          auVar98 = vpand_avx(auVar262,auVar175);
          auVar98 = vpcmpeqd_avx(auVar98,_DAT_005108e0);
          auVar149._0_4_ = auVar223._0_4_ + 1.0;
          auVar149._4_4_ = auVar223._4_4_ + 1.0;
          auVar149._8_4_ = auVar223._8_4_ + 1.0;
          auVar149._12_4_ = auVar223._12_4_ + 1.0;
          auVar98 = vblendvps_avx(auVar149,auVar109,auVar98);
          auVar109 = vpslld_avx(auVar175,0x1d);
          auVar104._8_4_ = 0x80000000;
          auVar104._0_8_ = 0x8000000080000000;
          auVar104._12_4_ = 0x80000000;
          auVar109 = vpand_avx(auVar109 ^ *(undefined1 (*) [16])pfVar12,auVar104);
          *(undefined1 (*) [16])pfVar12 = auVar109 ^ auVar98;
          pfVar12 = pfVar12 + 4;
          uVar8 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < iVar7) {
          uVar9 = CONCAT44(0,~uVar18 + iVar7);
          auVar25._8_8_ = 0;
          auVar25._0_8_ = uVar9;
          auVar20 = vpshufd_avx(auVar25,0x44);
          local_a0._16_16_ = auVar20;
          local_a0._0_16_ = auVar20;
          local_d0 = vpor_avx(auVar20,local_120);
          local_e0 = vpor_avx(auVar20,local_120);
          uVar14 = 0;
          auVar37 = _DAT_00512ca0;
          do {
            auVar26._8_8_ = 0;
            auVar26._0_8_ = uVar14;
            auVar20 = vpshufd_avx(auVar26,0x44);
            auVar44._16_16_ = auVar20;
            auVar44._0_16_ = auVar20;
            auVar47 = vorps_avx(auVar44,_DAT_00512c80);
            auVar37 = vorps_avx(auVar44,auVar37);
            auVar109 = vpor_avx(local_a0._16_16_,local_120);
            auVar20 = vpcmpgtq_avx(auVar37._16_16_ ^ local_120,auVar109);
            auVar98 = vpcmpgtq_avx(auVar37._0_16_ ^ local_120,local_d0);
            auVar20 = vpackssdw_avx(auVar98,auVar20);
            auVar175 = in_ZMM8._0_16_;
            auVar98 = vpcmpgtq_avx(auVar47._16_16_ ^ local_120,auVar109);
            auVar105._0_4_ = auVar47._0_4_ ^ local_120._0_4_;
            auVar105._4_4_ = auVar47._4_4_ ^ local_120._4_4_;
            auVar105._8_4_ = auVar47._8_4_ ^ local_120._8_4_;
            auVar105._12_4_ = auVar47._12_4_ ^ local_120._12_4_;
            auVar109 = vpcmpgtq_avx(auVar105,local_e0);
            auVar98 = vpackssdw_avx(auVar109,auVar98);
            auVar20 = vpackssdw_avx(auVar175 ^ auVar98,auVar175 ^ auVar20);
            auVar98 = vpmovsxwd_avx(auVar20);
            auVar20 = vpunpckhwd_avx(auVar20,auVar20);
            local_c0._16_16_ = auVar20;
            local_c0._0_16_ = auVar98;
            local_100 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(pfVar12 + uVar14));
            _local_140 = local_100._16_16_;
            local_150._0_4_ = sinf(local_100._16_4_);
            local_150._4_4_ = extraout_XMM0_Db_21;
            local_150._8_4_ = extraout_XMM0_Dc_21;
            local_150._12_4_ = extraout_XMM0_Dd_21;
            auVar20 = vmovshdup_avx(_local_140);
            auVar70._0_4_ = sinf(auVar20._0_4_);
            auVar70._4_60_ = extraout_var_09;
            local_150 = vinsertps_avx(local_150,auVar70._0_16_,0x10);
            auVar20 = vpermilpd_avx(_local_140,1);
            auVar71._0_4_ = sinf(auVar20._0_4_);
            auVar71._4_60_ = extraout_var_10;
            local_150 = vinsertps_avx(local_150,auVar71._0_16_,0x20);
            auVar20 = vpermilps_avx(_local_140,0xff);
            auVar72._0_4_ = sinf(auVar20._0_4_);
            auVar72._4_60_ = extraout_var_11;
            _local_140 = vinsertps_avx(local_150,auVar72._0_16_,0x30);
            local_150._0_4_ = sinf((float)local_100._0_4_);
            local_150._4_4_ = extraout_XMM0_Db_22;
            local_150._8_4_ = extraout_XMM0_Dc_22;
            local_150._12_4_ = extraout_XMM0_Dd_22;
            auVar20 = vmovshdup_avx(local_100._0_16_);
            auVar73._0_4_ = sinf(auVar20._0_4_);
            auVar73._4_60_ = extraout_var_12;
            local_150 = vinsertps_avx(local_150,auVar73._0_16_,0x10);
            auVar20 = vpermilpd_avx(local_100._0_16_,1);
            auVar74._0_4_ = sinf(auVar20._0_4_);
            auVar74._4_60_ = extraout_var_13;
            local_150 = vinsertps_avx(local_150,auVar74._0_16_,0x20);
            auVar20 = vpermilps_avx(local_100._0_16_,0xff);
            auVar75._0_4_ = sinf(auVar20._0_4_);
            auVar37 = _DAT_00512ca0;
            auVar75._4_60_ = extraout_var_14;
            auVar20 = vpcmpeqd_avx(auVar175,auVar175);
            in_ZMM8 = ZEXT1664(auVar20);
            auVar20 = vinsertps_avx(local_150,auVar75._0_16_,0x30);
            auVar45._16_16_ = _local_140;
            auVar45._0_16_ = auVar20;
            auVar47 = vmaskmovps_avx(local_c0,auVar45);
            *(undefined1 (*) [32])(pfVar12 + uVar14) = auVar47;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        local_128 = local_128 + 1;
      } while (local_128 != local_110);
    }
    break;
  case 10:
    local_110 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_110) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_128 = 0;
      local_120._8_8_ = 0x8000000000000000;
      local_120._0_8_ = 0x8000000000000000;
      do {
        auVar20 = in_ZMM7._0_16_;
        pfVar12 = (float *)(local_108->cstep * local_128 * local_108->elemsize +
                           (long)local_108->data);
        if (iVar7 < 8) {
          uVar18 = 0;
        }
        else {
          uVar8 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar12;
            afVar41 = (__m256)local_80;
            UnaryOp_x86_fma_functor::unary_op_cos::func_pack8
                      ((unary_op_cos *)&local_151,(__m256 *)local_80);
            auVar20 = in_ZMM7._0_16_;
            *(__m256 *)pfVar12 = afVar41;
            pfVar12 = pfVar12 + 8;
            uVar18 = uVar8 + 8;
            iVar13 = uVar8 + 0xf;
            uVar8 = uVar18;
          } while (iVar13 < iVar7);
        }
        uVar8 = uVar18 | 3;
        auVar20 = vpcmpeqd_avx(auVar20,auVar20);
        in_ZMM7 = ZEXT1664(auVar20);
        auVar228._8_4_ = 0xfffffffe;
        auVar228._0_8_ = 0xfffffffefffffffe;
        auVar228._12_4_ = 0xfffffffe;
        auVar248._8_4_ = 2;
        auVar248._0_8_ = 0x200000002;
        auVar248._12_4_ = 2;
        auVar292._8_4_ = 0xb97da000;
        auVar292._0_8_ = 0xb97da000b97da000;
        auVar292._12_4_ = 0xb97da000;
        auVar300._8_4_ = 0xb3222169;
        auVar300._0_8_ = 0xb3222169b3222169;
        auVar300._12_4_ = 0xb3222169;
        auVar309._8_4_ = 0xbab6061a;
        auVar309._0_8_ = 0xbab6061abab6061a;
        auVar309._12_4_ = 0xbab6061a;
        auVar320._8_4_ = 0x37ccf5ce;
        auVar320._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar320._12_4_ = 0x37ccf5ce;
        auVar283._8_4_ = 0x3c08839e;
        auVar283._0_8_ = 0x3c08839e3c08839e;
        auVar283._12_4_ = 0x3c08839e;
        auVar181._8_4_ = 0x80000000;
        auVar181._0_8_ = 0x8000000080000000;
        auVar181._12_4_ = 0x80000000;
        while ((int)uVar8 < iVar7) {
          auVar31._8_4_ = 0x7fffffff;
          auVar31._0_8_ = 0x7fffffff7fffffff;
          auVar31._12_4_ = 0x7fffffff;
          auVar98 = vandps_avx(auVar31,*(undefined1 (*) [16])pfVar12);
          auVar108._0_4_ = (int)(auVar98._0_4_ * 1.2732395);
          auVar108._4_4_ = (int)(auVar98._4_4_ * 1.2732395);
          auVar108._8_4_ = (int)(auVar98._8_4_ * 1.2732395);
          auVar108._12_4_ = (int)(auVar98._12_4_ * 1.2732395);
          auVar109 = vpsubd_avx(auVar108,auVar20);
          auVar175 = vpand_avx(auVar228,auVar109);
          auVar109 = vcvtdq2ps_avx(auVar175);
          auVar137._8_4_ = 0xbf490000;
          auVar137._0_8_ = 0xbf490000bf490000;
          auVar137._12_4_ = 0xbf490000;
          auVar98 = vfmadd231ps_fma(auVar98,auVar109,auVar137);
          auVar98 = vfmadd231ps_fma(auVar98,auVar109,auVar292);
          auVar223 = vfmadd231ps_fma(auVar98,auVar300,auVar109);
          auVar123._0_4_ = auVar223._0_4_ * auVar223._0_4_;
          auVar123._4_4_ = auVar223._4_4_ * auVar223._4_4_;
          auVar123._8_4_ = auVar223._8_4_ * auVar223._8_4_;
          auVar123._12_4_ = auVar223._12_4_ * auVar223._12_4_;
          auVar98 = vfmadd213ps_fma(auVar320,auVar123,auVar309);
          auVar157._8_4_ = 0x3d2aaaa5;
          auVar157._0_8_ = 0x3d2aaaa53d2aaaa5;
          auVar157._12_4_ = 0x3d2aaaa5;
          auVar98 = vfmadd213ps_fma(auVar98,auVar123,auVar157);
          auVar138._0_4_ = auVar123._0_4_ * auVar123._0_4_ * auVar98._0_4_;
          auVar138._4_4_ = auVar123._4_4_ * auVar123._4_4_ * auVar98._4_4_;
          auVar138._8_4_ = auVar123._8_4_ * auVar123._8_4_ * auVar98._8_4_;
          auVar138._12_4_ = auVar123._12_4_ * auVar123._12_4_ * auVar98._12_4_;
          auVar158._8_4_ = 0x3f000000;
          auVar158._0_8_ = 0x3f0000003f000000;
          auVar158._12_4_ = 0x3f000000;
          auVar233 = vfnmadd231ps_fma(auVar138,auVar123,auVar158);
          auVar159._8_4_ = 0xb94ca1f9;
          auVar159._0_8_ = 0xb94ca1f9b94ca1f9;
          auVar159._12_4_ = 0xb94ca1f9;
          auVar98 = vfmadd213ps_fma(auVar159,auVar123,auVar283);
          auVar195._8_4_ = 0xbe2aaaa3;
          auVar195._0_8_ = 0xbe2aaaa3be2aaaa3;
          auVar195._12_4_ = 0xbe2aaaa3;
          auVar98 = vfmadd213ps_fma(auVar98,auVar123,auVar195);
          auVar124._0_4_ = auVar98._0_4_ * auVar123._0_4_;
          auVar124._4_4_ = auVar98._4_4_ * auVar123._4_4_;
          auVar124._8_4_ = auVar98._8_4_ * auVar123._8_4_;
          auVar124._12_4_ = auVar98._12_4_ * auVar123._12_4_;
          auVar109 = vpaddd_avx(auVar228,auVar175);
          auVar175 = vfmadd213ps_fma(auVar124,auVar223,auVar223);
          auVar98 = vpand_avx(auVar248,auVar109);
          auVar98 = vpcmpeqd_avx(auVar98,_DAT_005108e0);
          auVar139._0_4_ = auVar233._0_4_ + 1.0;
          auVar139._4_4_ = auVar233._4_4_ + 1.0;
          auVar139._8_4_ = auVar233._8_4_ + 1.0;
          auVar139._12_4_ = auVar233._12_4_ + 1.0;
          auVar98 = vblendvps_avx(auVar139,auVar175,auVar98);
          auVar109 = vpslld_avx(auVar109,0x1d);
          auVar109 = vpand_avx(auVar109,auVar181);
          *(undefined1 (*) [16])pfVar12 = auVar109 ^ auVar181 ^ auVar98;
          pfVar12 = pfVar12 + 4;
          uVar8 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < iVar7) {
          uVar9 = CONCAT44(0,~uVar18 + iVar7);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar9;
          auVar20 = vpshufd_avx(auVar32,0x44);
          local_a0._16_16_ = auVar20;
          local_a0._0_16_ = auVar20;
          local_d0 = vpor_avx(auVar20,local_120);
          local_e0 = vpor_avx(auVar20,local_120);
          uVar14 = 0;
          auVar37 = _DAT_00512ca0;
          do {
            auVar33._8_8_ = 0;
            auVar33._0_8_ = uVar14;
            auVar20 = vpshufd_avx(auVar33,0x44);
            auVar53._16_16_ = auVar20;
            auVar53._0_16_ = auVar20;
            auVar47 = vorps_avx(auVar53,_DAT_00512c80);
            auVar37 = vorps_avx(auVar53,auVar37);
            auVar109 = vpor_avx(local_a0._16_16_,local_120);
            auVar20 = vpcmpgtq_avx(auVar37._16_16_ ^ local_120,auVar109);
            auVar98 = vpcmpgtq_avx(auVar37._0_16_ ^ local_120,local_d0);
            auVar20 = vpackssdw_avx(auVar98,auVar20);
            auVar175 = in_ZMM7._0_16_;
            auVar98 = vpcmpgtq_avx(auVar47._16_16_ ^ local_120,auVar109);
            auVar110._0_4_ = auVar47._0_4_ ^ local_120._0_4_;
            auVar110._4_4_ = auVar47._4_4_ ^ local_120._4_4_;
            auVar110._8_4_ = auVar47._8_4_ ^ local_120._8_4_;
            auVar110._12_4_ = auVar47._12_4_ ^ local_120._12_4_;
            auVar109 = vpcmpgtq_avx(auVar110,local_e0);
            auVar98 = vpackssdw_avx(auVar109,auVar98);
            auVar20 = vpackssdw_avx(auVar98 ^ auVar175,auVar20 ^ auVar175);
            auVar98 = vpmovsxwd_avx(auVar20);
            auVar20 = vpunpckhwd_avx(auVar20,auVar20);
            local_c0._16_16_ = auVar20;
            local_c0._0_16_ = auVar98;
            local_100 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(pfVar12 + uVar14));
            _local_140 = local_100._16_16_;
            local_150._0_4_ = cosf(local_100._16_4_);
            local_150._4_4_ = extraout_XMM0_Db_35;
            local_150._8_4_ = extraout_XMM0_Dc_35;
            local_150._12_4_ = extraout_XMM0_Dd_35;
            auVar20 = vmovshdup_avx(_local_140);
            auVar84._0_4_ = cosf(auVar20._0_4_);
            auVar84._4_60_ = extraout_var_23;
            local_150 = vinsertps_avx(local_150,auVar84._0_16_,0x10);
            auVar20 = vpermilpd_avx(_local_140,1);
            auVar85._0_4_ = cosf(auVar20._0_4_);
            auVar85._4_60_ = extraout_var_24;
            local_150 = vinsertps_avx(local_150,auVar85._0_16_,0x20);
            auVar20 = vpermilps_avx(_local_140,0xff);
            auVar86._0_4_ = cosf(auVar20._0_4_);
            auVar86._4_60_ = extraout_var_25;
            _local_140 = vinsertps_avx(local_150,auVar86._0_16_,0x30);
            local_150._0_4_ = cosf((float)local_100._0_4_);
            local_150._4_4_ = extraout_XMM0_Db_36;
            local_150._8_4_ = extraout_XMM0_Dc_36;
            local_150._12_4_ = extraout_XMM0_Dd_36;
            auVar20 = vmovshdup_avx(local_100._0_16_);
            auVar87._0_4_ = cosf(auVar20._0_4_);
            auVar87._4_60_ = extraout_var_26;
            local_150 = vinsertps_avx(local_150,auVar87._0_16_,0x10);
            auVar20 = vpermilpd_avx(local_100._0_16_,1);
            auVar88._0_4_ = cosf(auVar20._0_4_);
            auVar88._4_60_ = extraout_var_27;
            local_150 = vinsertps_avx(local_150,auVar88._0_16_,0x20);
            auVar20 = vpermilps_avx(local_100._0_16_,0xff);
            auVar89._0_4_ = cosf(auVar20._0_4_);
            auVar37 = _DAT_00512ca0;
            auVar89._4_60_ = extraout_var_28;
            auVar20 = vpcmpeqd_avx(auVar175,auVar175);
            in_ZMM7 = ZEXT1664(auVar20);
            auVar20 = vinsertps_avx(local_150,auVar89._0_16_,0x30);
            auVar54._16_16_ = _local_140;
            auVar54._0_16_ = auVar20;
            auVar47 = vmaskmovps_avx(local_c0,auVar54);
            *(undefined1 (*) [32])(pfVar12 + uVar14) = auVar47;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        local_128 = local_128 + 1;
      } while (local_128 != local_110);
    }
    break;
  case 0xb:
    local_60 = (long)bottom_top_blob->c;
    if (0 < local_60) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_110 = 0;
      local_120._8_8_ = 0x8000000000000000;
      local_120._0_8_ = 0x8000000000000000;
      local_128 = CONCAT44(local_128._4_4_,iVar7);
      do {
        pfVar12 = (float *)(local_108->cstep * local_110 * local_108->elemsize +
                           (long)local_108->data);
        iVar13 = (uint)local_128;
        if (iVar7 < 8) {
          uVar18 = 0;
        }
        else {
          uVar8 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar12;
            afVar41 = (__m256)local_80;
            UnaryOp_x86_fma_functor::unary_op_tan::func_pack8(&local_151,(__m256 *)local_80);
            *(__m256 *)pfVar12 = afVar41;
            pfVar12 = pfVar12 + 8;
            uVar18 = uVar8 + 8;
            iVar7 = uVar8 + 0xf;
            uVar8 = uVar18;
          } while (iVar7 < iVar13);
        }
        auVar20 = in_ZMM5._0_16_;
        uVar8 = uVar18 | 3;
        while ((int)uVar8 < iVar13) {
          local_80._0_16_ = *(undefined1 (*) [16])pfVar12;
          auVar96 = ZEXT856(*(ulong *)(pfVar12 + 2));
          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
          afVar325 = UnaryOp_x86_fma_functor::unary_op_tan::func_pack4
                               (&local_151,(__m128 *)local_80);
          auVar20 = in_ZMM5._0_16_;
          auVar61._0_8_ = afVar325._0_8_;
          auVar61._8_56_ = auVar96;
          *(undefined1 (*) [16])pfVar12 = auVar61._0_16_;
          pfVar12 = pfVar12 + 4;
          uVar8 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        auVar20 = vpcmpeqd_avx(auVar20,auVar20);
        in_ZMM5 = ZEXT1664(auVar20);
        if ((int)uVar18 < iVar13) {
          uVar9 = CONCAT44(0,~uVar18 + (uint)local_128);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar9;
          auVar98 = vpshufd_avx(auVar23,0x44);
          auVar20 = vpor_avx(auVar98,local_120);
          local_a0._0_16_ = auVar20;
          local_d0 = vpor_avx(auVar98,local_120);
          local_e0 = vpor_avx(auVar98,local_120);
          uVar14 = 0;
          auVar37 = _DAT_00512c80;
          auVar47 = _DAT_00512ca0;
          do {
            auVar24._8_8_ = 0;
            auVar24._0_8_ = uVar14;
            auVar20 = vpshufd_avx(auVar24,0x44);
            auVar42._16_16_ = auVar20;
            auVar42._0_16_ = auVar20;
            auVar37 = vorps_avx(auVar42,auVar37);
            auVar47 = vorps_avx(auVar42,auVar47);
            auVar20 = vpcmpgtq_avx(auVar47._16_16_ ^ local_120,local_a0._0_16_);
            auVar98 = vpcmpgtq_avx(auVar47._0_16_ ^ local_120,local_d0);
            auVar20 = vpackssdw_avx(auVar98,auVar20);
            auVar175 = in_ZMM5._0_16_;
            auVar98 = vpcmpgtq_avx(auVar37._16_16_ ^ local_120,local_a0._0_16_);
            auVar101._0_4_ = auVar37._0_4_ ^ local_120._0_4_;
            auVar101._4_4_ = auVar37._4_4_ ^ local_120._4_4_;
            auVar101._8_4_ = auVar37._8_4_ ^ local_120._8_4_;
            auVar101._12_4_ = auVar37._12_4_ ^ local_120._12_4_;
            auVar109 = vpcmpgtq_avx(auVar101,local_e0);
            auVar98 = vpackssdw_avx(auVar109,auVar98);
            auVar20 = vpackssdw_avx(auVar98 ^ auVar175,auVar20 ^ auVar175);
            auVar98 = vpmovsxwd_avx(auVar20);
            auVar20 = vpunpckhwd_avx(auVar20,auVar20);
            local_c0._16_16_ = auVar20;
            local_c0._0_16_ = auVar98;
            local_100 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(pfVar12 + uVar14));
            _local_140 = local_100._16_16_;
            local_150._0_4_ = tanf(local_100._16_4_);
            local_150._4_4_ = extraout_XMM0_Db_09;
            local_150._8_4_ = extraout_XMM0_Dc_09;
            local_150._12_4_ = extraout_XMM0_Dd_09;
            auVar20 = vmovshdup_avx(_local_140);
            auVar62._0_4_ = tanf(auVar20._0_4_);
            auVar62._4_60_ = extraout_var_01;
            local_150 = vinsertps_avx(local_150,auVar62._0_16_,0x10);
            auVar20 = vpermilpd_avx(_local_140,1);
            auVar63._0_4_ = tanf(auVar20._0_4_);
            auVar63._4_60_ = extraout_var_02;
            local_150 = vinsertps_avx(local_150,auVar63._0_16_,0x20);
            auVar20 = vpermilps_avx(_local_140,0xff);
            auVar64._0_4_ = tanf(auVar20._0_4_);
            auVar64._4_60_ = extraout_var_03;
            _local_140 = vinsertps_avx(local_150,auVar64._0_16_,0x30);
            local_150._0_4_ = tanf((float)local_100._0_4_);
            local_150._4_4_ = extraout_XMM0_Db_10;
            local_150._8_4_ = extraout_XMM0_Dc_10;
            local_150._12_4_ = extraout_XMM0_Dd_10;
            auVar20 = vmovshdup_avx(local_100._0_16_);
            auVar65._0_4_ = tanf(auVar20._0_4_);
            auVar65._4_60_ = extraout_var_04;
            local_150 = vinsertps_avx(local_150,auVar65._0_16_,0x10);
            auVar20 = vpermilpd_avx(local_100._0_16_,1);
            auVar66._0_4_ = tanf(auVar20._0_4_);
            auVar66._4_60_ = extraout_var_05;
            local_150 = vinsertps_avx(local_150,auVar66._0_16_,0x20);
            auVar20 = vpermilps_avx(local_100._0_16_,0xff);
            auVar67._0_4_ = tanf(auVar20._0_4_);
            auVar47 = _DAT_00512ca0;
            auVar37 = _DAT_00512c80;
            auVar67._4_60_ = extraout_var_06;
            auVar20 = vpcmpeqd_avx(auVar175,auVar175);
            in_ZMM5 = ZEXT1664(auVar20);
            auVar20 = vinsertps_avx(local_150,auVar67._0_16_,0x30);
            auVar43._16_16_ = _local_140;
            auVar43._0_16_ = auVar20;
            auVar128 = vmaskmovps_avx(local_c0,auVar43);
            *(undefined1 (*) [32])(pfVar12 + uVar14) = auVar128;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        local_110 = local_110 + 1;
        iVar7 = (uint)local_128;
      } while (local_110 != local_60);
    }
    break;
  case 0xc:
    local_e0._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_128 = CONCAT44(local_128._4_4_,iVar7) & 0xfffffffffffffff8;
      lVar15 = 0;
      do {
        pauVar17 = (undefined1 (*) [16])
                   (local_108->cstep * lVar15 * local_108->elemsize + (long)local_108->data);
        if (iVar7 < 8) {
          uVar18 = 0;
        }
        else {
          iVar13 = 7;
          do {
            local_140._0_4_ = *(float *)(*pauVar17 + 4);
            fVar19 = asinf(*(float *)*pauVar17);
            auVar37 = local_100;
            local_100._4_4_ = extraout_XMM0_Db_11;
            local_100._0_4_ = fVar19;
            local_100._8_4_ = extraout_XMM0_Dc_11;
            local_100._16_16_ = auVar37._16_16_;
            local_100._12_4_ = extraout_XMM0_Dd_11;
            local_140._0_4_ = asinf((float)local_140._0_4_);
            local_140._4_4_ = extraout_XMM0_Db_12;
            uStack_138 = extraout_XMM0_Dc_12;
            uStack_134 = extraout_XMM0_Dd_12;
            fVar19 = asinf(*(float *)(*pauVar17 + 8));
            auVar37 = local_c0;
            local_c0._4_4_ = extraout_XMM0_Db_13;
            local_c0._0_4_ = fVar19;
            local_c0._8_4_ = extraout_XMM0_Dc_13;
            local_c0._16_16_ = auVar37._16_16_;
            local_c0._12_4_ = extraout_XMM0_Dd_13;
            local_150._0_4_ = asinf(*(float *)(*pauVar17 + 0xc));
            local_150._4_4_ = extraout_XMM0_Db_14;
            local_150._8_4_ = extraout_XMM0_Dc_14;
            local_150._12_4_ = extraout_XMM0_Dd_14;
            local_120._0_4_ = asinf(*(float *)pauVar17[1]);
            local_120._4_4_ = extraout_XMM0_Db_15;
            local_120._8_4_ = extraout_XMM0_Dc_15;
            local_120._12_4_ = extraout_XMM0_Dd_15;
            fVar19 = asinf(*(float *)(pauVar17[1] + 4));
            auVar37 = local_a0;
            local_a0._4_4_ = extraout_XMM0_Db_16;
            local_a0._0_4_ = fVar19;
            local_a0._8_4_ = extraout_XMM0_Dc_16;
            local_a0._16_16_ = auVar37._16_16_;
            local_a0._12_4_ = extraout_XMM0_Dd_16;
            local_d0._0_4_ = asinf(*(float *)(pauVar17[1] + 8));
            local_d0._4_4_ = extraout_XMM0_Db_17;
            local_d0._8_4_ = extraout_XMM0_Dc_17;
            local_d0._12_4_ = extraout_XMM0_Dd_17;
            auVar68._0_4_ = asinf(*(float *)(pauVar17[1] + 0xc));
            auVar68._4_60_ = extraout_var_07;
            auVar20 = vinsertps_avx(local_120,ZEXT416((uint)local_a0._0_4_),0x10);
            auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)local_d0._0_4_),0x20);
            auVar20 = vinsertps_avx(auVar20,auVar68._0_16_,0x30);
            auVar98 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
            auVar98 = vinsertps_avx(auVar98,ZEXT416((uint)local_c0._0_4_),0x20);
            auVar98 = vinsertps_avx(auVar98,ZEXT416((uint)local_150._0_4_),0x30);
            *pauVar17 = auVar98;
            pauVar17[1] = auVar20;
            pauVar17 = pauVar17 + 2;
            iVar13 = iVar13 + 8;
          } while (iVar13 < iVar7);
          uVar18 = (uint)local_128;
        }
        uVar8 = uVar18 | 3;
        while ((int)uVar8 < iVar7) {
          local_140._0_4_ = *(float *)(*pauVar17 + 4);
          fVar19 = asinf(*(float *)*pauVar17);
          auVar37 = local_100;
          local_100._4_4_ = extraout_XMM0_Db_18;
          local_100._0_4_ = fVar19;
          local_100._8_4_ = extraout_XMM0_Dc_18;
          local_100._16_16_ = auVar37._16_16_;
          local_100._12_4_ = extraout_XMM0_Dd_18;
          local_140._0_4_ = asinf((float)local_140._0_4_);
          local_140._4_4_ = extraout_XMM0_Db_19;
          uStack_138 = extraout_XMM0_Dc_19;
          uStack_134 = extraout_XMM0_Dd_19;
          fVar19 = asinf(*(float *)(*pauVar17 + 8));
          auVar37 = local_c0;
          local_c0._4_4_ = extraout_XMM0_Db_20;
          local_c0._0_4_ = fVar19;
          local_c0._8_4_ = extraout_XMM0_Dc_20;
          local_c0._16_16_ = auVar37._16_16_;
          local_c0._12_4_ = extraout_XMM0_Dd_20;
          auVar69._0_4_ = asinf(*(float *)(*pauVar17 + 0xc));
          auVar69._4_60_ = extraout_var_08;
          auVar20 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
          auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)local_c0._0_4_),0x20);
          auVar20 = vinsertps_avx(auVar20,auVar69._0_16_,0x30);
          *pauVar17 = auVar20;
          pauVar17 = pauVar17 + 1;
          uVar8 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if (iVar7 - uVar18 != 0 && (int)uVar18 <= iVar7) {
          lVar11 = 0;
          do {
            fVar19 = asinf(*(float *)(*pauVar17 + lVar11 * 4));
            *(float *)(*pauVar17 + lVar11 * 4) = fVar19;
            lVar11 = lVar11 + 1;
          } while (iVar7 - uVar18 != (int)lVar11);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != local_e0._0_8_);
    }
    break;
  case 0xd:
    local_e0._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_128 = CONCAT44(local_128._4_4_,iVar7) & 0xfffffffffffffff8;
      lVar15 = 0;
      do {
        pauVar17 = (undefined1 (*) [16])
                   (local_108->cstep * lVar15 * local_108->elemsize + (long)local_108->data);
        if (iVar7 < 8) {
          uVar18 = 0;
        }
        else {
          iVar13 = 7;
          do {
            local_140._0_4_ = *(float *)(*pauVar17 + 4);
            fVar19 = acosf(*(float *)*pauVar17);
            auVar37 = local_100;
            local_100._4_4_ = extraout_XMM0_Db_25;
            local_100._0_4_ = fVar19;
            local_100._8_4_ = extraout_XMM0_Dc_25;
            local_100._16_16_ = auVar37._16_16_;
            local_100._12_4_ = extraout_XMM0_Dd_25;
            local_140._0_4_ = acosf((float)local_140._0_4_);
            local_140._4_4_ = extraout_XMM0_Db_26;
            uStack_138 = extraout_XMM0_Dc_26;
            uStack_134 = extraout_XMM0_Dd_26;
            fVar19 = acosf(*(float *)(*pauVar17 + 8));
            auVar37 = local_c0;
            local_c0._4_4_ = extraout_XMM0_Db_27;
            local_c0._0_4_ = fVar19;
            local_c0._8_4_ = extraout_XMM0_Dc_27;
            local_c0._16_16_ = auVar37._16_16_;
            local_c0._12_4_ = extraout_XMM0_Dd_27;
            local_150._0_4_ = acosf(*(float *)(*pauVar17 + 0xc));
            local_150._4_4_ = extraout_XMM0_Db_28;
            local_150._8_4_ = extraout_XMM0_Dc_28;
            local_150._12_4_ = extraout_XMM0_Dd_28;
            local_120._0_4_ = acosf(*(float *)pauVar17[1]);
            local_120._4_4_ = extraout_XMM0_Db_29;
            local_120._8_4_ = extraout_XMM0_Dc_29;
            local_120._12_4_ = extraout_XMM0_Dd_29;
            fVar19 = acosf(*(float *)(pauVar17[1] + 4));
            auVar37 = local_a0;
            local_a0._4_4_ = extraout_XMM0_Db_30;
            local_a0._0_4_ = fVar19;
            local_a0._8_4_ = extraout_XMM0_Dc_30;
            local_a0._16_16_ = auVar37._16_16_;
            local_a0._12_4_ = extraout_XMM0_Dd_30;
            local_d0._0_4_ = acosf(*(float *)(pauVar17[1] + 8));
            local_d0._4_4_ = extraout_XMM0_Db_31;
            local_d0._8_4_ = extraout_XMM0_Dc_31;
            local_d0._12_4_ = extraout_XMM0_Dd_31;
            auVar82._0_4_ = acosf(*(float *)(pauVar17[1] + 0xc));
            auVar82._4_60_ = extraout_var_21;
            auVar20 = vinsertps_avx(local_120,ZEXT416((uint)local_a0._0_4_),0x10);
            auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)local_d0._0_4_),0x20);
            auVar20 = vinsertps_avx(auVar20,auVar82._0_16_,0x30);
            auVar98 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
            auVar98 = vinsertps_avx(auVar98,ZEXT416((uint)local_c0._0_4_),0x20);
            auVar98 = vinsertps_avx(auVar98,ZEXT416((uint)local_150._0_4_),0x30);
            *pauVar17 = auVar98;
            pauVar17[1] = auVar20;
            pauVar17 = pauVar17 + 2;
            iVar13 = iVar13 + 8;
          } while (iVar13 < iVar7);
          uVar18 = (uint)local_128;
        }
        uVar8 = uVar18 | 3;
        while ((int)uVar8 < iVar7) {
          local_140._0_4_ = *(float *)(*pauVar17 + 4);
          fVar19 = acosf(*(float *)*pauVar17);
          auVar37 = local_100;
          local_100._4_4_ = extraout_XMM0_Db_32;
          local_100._0_4_ = fVar19;
          local_100._8_4_ = extraout_XMM0_Dc_32;
          local_100._16_16_ = auVar37._16_16_;
          local_100._12_4_ = extraout_XMM0_Dd_32;
          local_140._0_4_ = acosf((float)local_140._0_4_);
          local_140._4_4_ = extraout_XMM0_Db_33;
          uStack_138 = extraout_XMM0_Dc_33;
          uStack_134 = extraout_XMM0_Dd_33;
          fVar19 = acosf(*(float *)(*pauVar17 + 8));
          auVar37 = local_c0;
          local_c0._4_4_ = extraout_XMM0_Db_34;
          local_c0._0_4_ = fVar19;
          local_c0._8_4_ = extraout_XMM0_Dc_34;
          local_c0._16_16_ = auVar37._16_16_;
          local_c0._12_4_ = extraout_XMM0_Dd_34;
          auVar83._0_4_ = acosf(*(float *)(*pauVar17 + 0xc));
          auVar83._4_60_ = extraout_var_22;
          auVar20 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
          auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)local_c0._0_4_),0x20);
          auVar20 = vinsertps_avx(auVar20,auVar83._0_16_,0x30);
          *pauVar17 = auVar20;
          pauVar17 = pauVar17 + 1;
          uVar8 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if (iVar7 - uVar18 != 0 && (int)uVar18 <= iVar7) {
          lVar11 = 0;
          do {
            fVar19 = acosf(*(float *)(*pauVar17 + lVar11 * 4));
            *(float *)(*pauVar17 + lVar11 * 4) = fVar19;
            lVar11 = lVar11 + 1;
          } while (iVar7 - uVar18 != (int)lVar11);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != local_e0._0_8_);
    }
    break;
  case 0xe:
    local_e0._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_128 = CONCAT44(local_128._4_4_,iVar7) & 0xfffffffffffffff8;
      lVar15 = 0;
      do {
        pauVar17 = (undefined1 (*) [16])
                   (local_108->cstep * lVar15 * local_108->elemsize + (long)local_108->data);
        if (iVar7 < 8) {
          uVar18 = 0;
        }
        else {
          iVar13 = 7;
          do {
            local_140._0_4_ = *(float *)(*pauVar17 + 4);
            fVar19 = atanf(*(float *)*pauVar17);
            auVar37 = local_100;
            local_100._4_4_ = extraout_XMM0_Db;
            local_100._0_4_ = fVar19;
            local_100._8_4_ = extraout_XMM0_Dc;
            local_100._16_16_ = auVar37._16_16_;
            local_100._12_4_ = extraout_XMM0_Dd;
            local_140._0_4_ = atanf((float)local_140._0_4_);
            local_140._4_4_ = extraout_XMM0_Db_00;
            uStack_138 = extraout_XMM0_Dc_00;
            uStack_134 = extraout_XMM0_Dd_00;
            fVar19 = atanf(*(float *)(*pauVar17 + 8));
            auVar37 = local_c0;
            local_c0._4_4_ = extraout_XMM0_Db_01;
            local_c0._0_4_ = fVar19;
            local_c0._8_4_ = extraout_XMM0_Dc_01;
            local_c0._16_16_ = auVar37._16_16_;
            local_c0._12_4_ = extraout_XMM0_Dd_01;
            local_150._0_4_ = atanf(*(float *)(*pauVar17 + 0xc));
            local_150._4_4_ = extraout_XMM0_Db_02;
            local_150._8_4_ = extraout_XMM0_Dc_02;
            local_150._12_4_ = extraout_XMM0_Dd_02;
            local_120._0_4_ = atanf(*(float *)pauVar17[1]);
            local_120._4_4_ = extraout_XMM0_Db_03;
            local_120._8_4_ = extraout_XMM0_Dc_03;
            local_120._12_4_ = extraout_XMM0_Dd_03;
            fVar19 = atanf(*(float *)(pauVar17[1] + 4));
            auVar37 = local_a0;
            local_a0._4_4_ = extraout_XMM0_Db_04;
            local_a0._0_4_ = fVar19;
            local_a0._8_4_ = extraout_XMM0_Dc_04;
            local_a0._16_16_ = auVar37._16_16_;
            local_a0._12_4_ = extraout_XMM0_Dd_04;
            local_d0._0_4_ = atanf(*(float *)(pauVar17[1] + 8));
            local_d0._4_4_ = extraout_XMM0_Db_05;
            local_d0._8_4_ = extraout_XMM0_Dc_05;
            local_d0._12_4_ = extraout_XMM0_Dd_05;
            auVar58._0_4_ = atanf(*(float *)(pauVar17[1] + 0xc));
            auVar58._4_60_ = extraout_var;
            auVar20 = vinsertps_avx(local_120,ZEXT416((uint)local_a0._0_4_),0x10);
            auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)local_d0._0_4_),0x20);
            auVar20 = vinsertps_avx(auVar20,auVar58._0_16_,0x30);
            auVar98 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
            auVar98 = vinsertps_avx(auVar98,ZEXT416((uint)local_c0._0_4_),0x20);
            auVar98 = vinsertps_avx(auVar98,ZEXT416((uint)local_150._0_4_),0x30);
            *pauVar17 = auVar98;
            pauVar17[1] = auVar20;
            pauVar17 = pauVar17 + 2;
            iVar13 = iVar13 + 8;
          } while (iVar13 < iVar7);
          uVar18 = (uint)local_128;
        }
        uVar8 = uVar18 | 3;
        while ((int)uVar8 < iVar7) {
          local_140._0_4_ = *(float *)(*pauVar17 + 4);
          fVar19 = atanf(*(float *)*pauVar17);
          auVar37 = local_100;
          local_100._4_4_ = extraout_XMM0_Db_06;
          local_100._0_4_ = fVar19;
          local_100._8_4_ = extraout_XMM0_Dc_06;
          local_100._16_16_ = auVar37._16_16_;
          local_100._12_4_ = extraout_XMM0_Dd_06;
          local_140._0_4_ = atanf((float)local_140._0_4_);
          local_140._4_4_ = extraout_XMM0_Db_07;
          uStack_138 = extraout_XMM0_Dc_07;
          uStack_134 = extraout_XMM0_Dd_07;
          fVar19 = atanf(*(float *)(*pauVar17 + 8));
          auVar37 = local_c0;
          local_c0._4_4_ = extraout_XMM0_Db_08;
          local_c0._0_4_ = fVar19;
          local_c0._8_4_ = extraout_XMM0_Dc_08;
          local_c0._16_16_ = auVar37._16_16_;
          local_c0._12_4_ = extraout_XMM0_Dd_08;
          auVar60._0_4_ = atanf(*(float *)(*pauVar17 + 0xc));
          auVar60._4_60_ = extraout_var_00;
          auVar20 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
          auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)local_c0._0_4_),0x20);
          auVar20 = vinsertps_avx(auVar20,auVar60._0_16_,0x30);
          *pauVar17 = auVar20;
          pauVar17 = pauVar17 + 1;
          uVar8 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if (iVar7 - uVar18 != 0 && (int)uVar18 <= iVar7) {
          lVar11 = 0;
          do {
            fVar19 = atanf(*(float *)(*pauVar17 + lVar11 * 4));
            *(float *)(*pauVar17 + lVar11 * 4) = fVar19;
            lVar11 = lVar11 + 1;
          } while (iVar7 - uVar18 != (int)lVar11);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != local_e0._0_8_);
    }
    break;
  case 0xf:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar15 = 0;
      auVar46._8_4_ = 0x3f800000;
      auVar46._0_8_ = 0x3f8000003f800000;
      auVar46._12_4_ = 0x3f800000;
      auVar46._16_4_ = 0x3f800000;
      auVar46._20_4_ = 0x3f800000;
      auVar46._24_4_ = 0x3f800000;
      auVar46._28_4_ = 0x3f800000;
      auVar106._8_4_ = 0x3f800000;
      auVar106._0_8_ = 0x3f8000003f800000;
      auVar106._12_4_ = 0x3f800000;
      auVar151._8_8_ = 0x8000000000000000;
      auVar151._0_8_ = 0x8000000000000000;
      auVar20 = vpcmpeqd_avx(auVar98,auVar98);
      do {
        pauVar16 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar128 = vrcpps_avx(*pauVar16);
            auVar98 = vfmsub213ps_fma(*pauVar16,auVar128,auVar46);
            auVar98 = vfnmadd132ps_fma(ZEXT1632(auVar98),auVar128,auVar128);
            *pauVar16 = ZEXT1632(auVar98);
            pauVar16 = pauVar16 + 1;
            iVar13 = iVar13 + 8;
            uVar8 = uVar18 & 0xfffffff8;
          } while (iVar13 < (int)uVar18);
        }
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar98 = vrcpps_avx(*(undefined1 (*) [16])*pauVar16);
          auVar109 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar16,auVar98,auVar106);
          auVar98 = vfnmadd132ps_fma(auVar109,auVar98,auVar98);
          *(undefined1 (*) [16])*pauVar16 = auVar98;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if ((int)uVar8 < (int)uVar18) {
          uVar9 = CONCAT44(0,~uVar8 + uVar18);
          auVar189._8_8_ = 0;
          auVar189._0_8_ = uVar9;
          auVar175 = vpshufd_avx(auVar189,0x44);
          auVar98 = vorps_avx(auVar175,auVar151);
          auVar109 = vorps_avx(auVar175,auVar151);
          auVar175 = vorps_avx(auVar175,auVar151);
          uVar14 = 0;
          do {
            auVar239._8_8_ = 0;
            auVar239._0_8_ = uVar14;
            auVar223 = vpshufd_avx(auVar239,0x44);
            auVar251._16_16_ = auVar223;
            auVar251._0_16_ = auVar223;
            auVar128 = vorps_avx(auVar251,auVar37);
            auVar141 = vorps_avx(auVar251,auVar47);
            auVar276._0_8_ = auVar141._16_8_ ^ 0x8000000000000000;
            auVar276._8_4_ = auVar141._24_4_;
            auVar276._12_4_ = auVar141._28_4_ ^ 0x80000000;
            auVar223 = vpcmpgtq_avx(auVar276,auVar98);
            auVar240._0_8_ = auVar141._0_8_ ^ 0x8000000000000000;
            auVar240._8_4_ = auVar141._8_4_;
            auVar240._12_4_ = auVar141._12_4_ ^ 0x80000000;
            auVar233 = vpcmpgtq_avx(auVar240,auVar109);
            auVar223 = vpackssdw_avx(auVar233,auVar223);
            auVar277._0_8_ = auVar128._16_8_ ^ 0x8000000000000000;
            auVar277._8_4_ = auVar128._24_4_;
            auVar277._12_4_ = auVar128._28_4_ ^ 0x80000000;
            auVar233 = vpcmpgtq_avx(auVar277,auVar98);
            auVar263._0_8_ = auVar128._0_8_ ^ 0x8000000000000000;
            auVar263._8_4_ = auVar128._8_4_;
            auVar263._12_4_ = auVar128._12_4_ ^ 0x80000000;
            auVar261 = vpcmpgtq_avx(auVar263,auVar175);
            auVar233 = vpackssdw_avx(auVar261,auVar233);
            auVar223 = vpackssdw_avx(auVar233 ^ auVar20,auVar223 ^ auVar20);
            auVar233 = vpmovsxwd_avx(auVar223);
            auVar223 = vpunpckhwd_avx(auVar223,auVar223);
            auVar252._16_16_ = auVar223;
            auVar252._0_16_ = auVar233;
            auVar141 = vmaskmovps_avx(auVar252,*(undefined1 (*) [32])(*pauVar16 + uVar14 * 4));
            auVar128 = vrcpps_avx(auVar141);
            auVar223 = vfmsub213ps_fma(auVar141,auVar128,auVar46);
            auVar223 = vfnmadd132ps_fma(ZEXT1632(auVar223),auVar128,auVar128);
            auVar128 = vmaskmovps_avx(auVar252,ZEXT1632(auVar223));
            *(undefined1 (*) [32])(*pauVar16 + uVar14 * 4) = auVar128;
            uVar14 = uVar14 + 8;
          } while ((uVar9 + 8 & 0x1fffffff8) != uVar14);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar7);
    }
    break;
  case 0x10:
    local_100._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar18 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_140._0_4_ = uVar18 & 0xfffffff8;
      lVar15 = 0;
      do {
        auVar294._8_4_ = 0x395e8083;
        auVar294._0_8_ = 0x395e8083395e8083;
        auVar270._8_4_ = 0x3f318000;
        auVar270._0_8_ = 0x3f3180003f318000;
        auVar250._8_4_ = 0x3f800000;
        auVar250._0_8_ = 0x3f8000003f800000;
        auVar214._8_4_ = 0x3f000000;
        auVar214._0_8_ = 0x3f0000003f000000;
        auVar198._8_4_ = 0x3d2aa9c1;
        auVar198._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar183._8_4_ = 0x3c088908;
        auVar183._0_8_ = 0x3c0889083c088908;
        auVar165._8_4_ = 0xc0000000;
        auVar165._0_8_ = 0xc0000000c0000000;
        auVar141._8_4_ = 0x3fb8aa3b;
        auVar141._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar128._8_4_ = 0xc2b0c0a5;
        auVar128._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar47._8_4_ = 0x42b0c0a5;
        auVar47._0_8_ = 0x42b0c0a542b0c0a5;
        auVar37._8_4_ = 0x39506967;
        auVar37._0_8_ = 0x3950696739506967;
        auVar294._12_4_ = 0x395e8083;
        auVar270._12_4_ = 0x3f318000;
        auVar250._12_4_ = 0x3f800000;
        auVar214._12_4_ = 0x3f000000;
        auVar198._12_4_ = 0x3d2aa9c1;
        auVar183._12_4_ = 0x3c088908;
        auVar165._12_4_ = 0xc0000000;
        auVar141._12_4_ = 0x3fb8aa3b;
        auVar128._12_4_ = 0xc2b0c0a5;
        auVar47._12_4_ = 0x42b0c0a5;
        auVar37._12_4_ = 0x39506967;
        auVar294._16_4_ = 0x395e8083;
        auVar270._16_4_ = 0x3f318000;
        auVar250._16_4_ = 0x3f800000;
        auVar214._16_4_ = 0x3f000000;
        auVar198._16_4_ = 0x3d2aa9c1;
        auVar183._16_4_ = 0x3c088908;
        auVar165._16_4_ = 0xc0000000;
        auVar141._16_4_ = 0x3fb8aa3b;
        auVar128._16_4_ = 0xc2b0c0a5;
        auVar47._16_4_ = 0x42b0c0a5;
        auVar37._16_4_ = 0x39506967;
        auVar294._20_4_ = 0x395e8083;
        auVar270._20_4_ = 0x3f318000;
        auVar250._20_4_ = 0x3f800000;
        auVar214._20_4_ = 0x3f000000;
        auVar198._20_4_ = 0x3d2aa9c1;
        auVar183._20_4_ = 0x3c088908;
        auVar165._20_4_ = 0xc0000000;
        auVar141._20_4_ = 0x3fb8aa3b;
        auVar128._20_4_ = 0xc2b0c0a5;
        auVar47._20_4_ = 0x42b0c0a5;
        auVar37._20_4_ = 0x39506967;
        auVar294._24_4_ = 0x395e8083;
        auVar270._24_4_ = 0x3f318000;
        auVar250._24_4_ = 0x3f800000;
        auVar214._24_4_ = 0x3f000000;
        auVar198._24_4_ = 0x3d2aa9c1;
        auVar183._24_4_ = 0x3c088908;
        auVar165._24_4_ = 0xc0000000;
        auVar141._24_4_ = 0x3fb8aa3b;
        auVar128._24_4_ = 0xc2b0c0a5;
        auVar47._24_4_ = 0x42b0c0a5;
        auVar37._24_4_ = 0x39506967;
        auVar294._28_4_ = 0x395e8083;
        auVar270._28_4_ = 0x3f318000;
        auVar250._28_4_ = 0x3f800000;
        auVar214._28_4_ = 0x3f000000;
        auVar198._28_4_ = 0x3d2aa9c1;
        auVar183._28_4_ = 0x3c088908;
        auVar165._28_4_ = 0xc0000000;
        auVar141._28_4_ = 0x3fb8aa3b;
        auVar128._28_4_ = 0xc2b0c0a5;
        auVar47._28_4_ = 0x42b0c0a5;
        auVar37._28_4_ = 0x39506967;
        auVar58 = ZEXT3264(auVar37);
        pauVar16 = (undefined1 (*) [32])
                   (local_108->cstep * lVar15 * local_108->elemsize + (long)local_108->data);
        if ((int)uVar18 < 8) {
          uVar8 = 0;
        }
        else {
          iVar7 = 7;
          do {
            auVar59._0_4_ = *(float *)*pauVar16 * -2.0;
            auVar59._4_4_ = *(float *)((long)*pauVar16 + 4) * -2.0;
            auVar59._8_4_ = *(float *)((long)*pauVar16 + 8) * -2.0;
            auVar59._12_4_ = *(float *)((long)*pauVar16 + 0xc) * -2.0;
            auVar59._16_4_ = *(float *)((long)*pauVar16 + 0x10) * -2.0;
            auVar59._20_4_ = *(float *)((long)*pauVar16 + 0x14) * -2.0;
            auVar59._28_36_ = auVar58._28_36_;
            auVar59._24_4_ = *(float *)((long)*pauVar16 + 0x18) * -2.0;
            auVar40 = vminps_avx(auVar59._0_32_,auVar47);
            auVar1 = vmaxps_avx(auVar40,auVar128);
            auVar20 = vfmadd213ps_fma(auVar141,auVar1,auVar214);
            auVar39 = vroundps_avx(ZEXT1632(auVar20),1);
            auVar40 = vcmpps_avx(ZEXT1632(auVar20),auVar39,1);
            auVar40 = vandps_avx(auVar250,auVar40);
            auVar40 = vsubps_avx(auVar39,auVar40);
            auVar20 = vfmsub231ps_fma(auVar1,auVar40,auVar270);
            auVar98 = vfmsub231ps_fma(ZEXT1632(auVar20),auVar40,auVar294);
            auVar38 = ZEXT1632(auVar98);
            auVar1._28_4_ = auVar39._28_4_;
            auVar1._0_28_ =
                 ZEXT1628(CONCAT412(auVar98._12_4_ * auVar98._12_4_,
                                    CONCAT48(auVar98._8_4_ * auVar98._8_4_,
                                             CONCAT44(auVar98._4_4_ * auVar98._4_4_,
                                                      auVar98._0_4_ * auVar98._0_4_))));
            auVar302._8_4_ = 0x3ab743ce;
            auVar302._0_8_ = 0x3ab743ce3ab743ce;
            auVar302._12_4_ = 0x3ab743ce;
            auVar302._16_4_ = 0x3ab743ce;
            auVar302._20_4_ = 0x3ab743ce;
            auVar302._24_4_ = 0x3ab743ce;
            auVar302._28_4_ = 0x3ab743ce;
            auVar20 = vfmadd213ps_fma(auVar37,auVar38,auVar302);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar38,auVar183);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar38,auVar198);
            auVar303._8_4_ = 0x3e2aaaaa;
            auVar303._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar303._12_4_ = 0x3e2aaaaa;
            auVar303._16_4_ = 0x3e2aaaaa;
            auVar303._20_4_ = 0x3e2aaaaa;
            auVar303._24_4_ = 0x3e2aaaaa;
            auVar303._28_4_ = 0x3e2aaaaa;
            auVar39 = ZEXT1632(auVar98);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar39,auVar303);
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar39,auVar214);
            auVar109 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar1,auVar39);
            auVar20._0_4_ = (int)auVar40._0_4_;
            auVar20._4_4_ = (int)auVar40._4_4_;
            auVar20._8_4_ = (int)auVar40._8_4_;
            auVar20._12_4_ = (int)auVar40._12_4_;
            auVar39._16_4_ = (int)auVar40._16_4_;
            auVar39._0_16_ = auVar20;
            auVar39._20_4_ = (int)auVar40._20_4_;
            auVar39._24_4_ = (int)auVar40._24_4_;
            auVar39._28_4_ = (int)auVar40._28_4_;
            auVar98 = vpslld_avx(auVar20,0x17);
            auVar20 = vpslld_avx(auVar39._16_16_,0x17);
            auVar175._8_4_ = 0x3f800000;
            auVar175._0_8_ = 0x3f8000003f800000;
            auVar175._12_4_ = 0x3f800000;
            auVar20 = vpaddd_avx(auVar175,auVar20);
            auVar98 = vpaddd_avx(auVar175,auVar98);
            auVar40._16_16_ = auVar20;
            auVar40._0_16_ = auVar98;
            auVar38._0_4_ = auVar109._0_4_ + 1.0;
            auVar38._4_4_ = auVar109._4_4_ + 1.0;
            auVar38._8_4_ = auVar109._8_4_ + 1.0;
            auVar38._12_4_ = auVar109._12_4_ + 1.0;
            auVar38._16_4_ = 0x3f800000;
            auVar38._20_4_ = 0x3f800000;
            auVar38._24_4_ = 0x3f800000;
            auVar38._28_4_ = 0x3f800000;
            auVar20 = vfmadd213ps_fma(auVar40,auVar38,auVar250);
            auVar40 = vrcpps_avx(ZEXT1632(auVar20));
            auVar20 = vfmsub213ps_fma(ZEXT1632(auVar20),auVar40,auVar250);
            auVar20 = vfnmadd132ps_fma(ZEXT1632(auVar20),auVar40,auVar40);
            auVar20 = vfnmsub213ps_fma(ZEXT1632(auVar20),auVar165,auVar250);
            auVar58 = ZEXT1664(auVar20);
            *pauVar16 = ZEXT1632(auVar20);
            pauVar16 = pauVar16 + 1;
            iVar7 = iVar7 + 8;
          } while (iVar7 < (int)uVar18);
          uVar8 = local_140._0_4_;
        }
        auVar98._8_4_ = 0x3f800000;
        auVar98._0_8_ = 0x3f8000003f800000;
        auVar98._12_4_ = 0x3f800000;
        auVar109._8_4_ = 0xc2b0c0a5;
        auVar109._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar109._12_4_ = 0xc2b0c0a5;
        auVar223._8_4_ = 0x3fb8aa3b;
        auVar223._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar223._12_4_ = 0x3fb8aa3b;
        auVar233._8_4_ = 0x3f000000;
        auVar233._0_8_ = 0x3f0000003f000000;
        auVar233._12_4_ = 0x3f000000;
        auVar261._8_4_ = 0x3f318000;
        auVar261._0_8_ = 0x3f3180003f318000;
        auVar261._12_4_ = 0x3f318000;
        auVar274._8_4_ = 0x395e8083;
        auVar274._0_8_ = 0x395e8083395e8083;
        auVar274._12_4_ = 0x395e8083;
        auVar289._8_4_ = 0x3ab743ce;
        auVar289._0_8_ = 0x3ab743ce3ab743ce;
        auVar289._12_4_ = 0x3ab743ce;
        auVar296._8_4_ = 0x39506967;
        auVar296._0_8_ = 0x3950696739506967;
        auVar296._12_4_ = 0x39506967;
        auVar306._8_4_ = 0x3c088908;
        auVar306._0_8_ = 0x3c0889083c088908;
        auVar306._12_4_ = 0x3c088908;
        auVar313._8_4_ = 0x3d2aa9c1;
        auVar313._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar313._12_4_ = 0x3d2aa9c1;
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar18) {
          auVar21._0_4_ = *(float *)*pauVar16 * -2.0;
          auVar21._4_4_ = *(float *)((long)*pauVar16 + 4) * -2.0;
          auVar21._8_4_ = *(float *)((long)*pauVar16 + 8) * -2.0;
          auVar21._12_4_ = *(float *)((long)*pauVar16 + 0xc) * -2.0;
          auVar99._8_4_ = 0x42b0c0a5;
          auVar99._0_8_ = 0x42b0c0a542b0c0a5;
          auVar99._12_4_ = 0x42b0c0a5;
          auVar20 = vminps_avx(auVar21,auVar99);
          auVar21 = vmaxps_avx(auVar20,auVar109);
          auVar20 = vfmadd213ps_fma(auVar223,auVar21,auVar233);
          auVar114._0_4_ = (int)auVar20._0_4_;
          auVar114._4_4_ = (int)auVar20._4_4_;
          auVar114._8_4_ = (int)auVar20._8_4_;
          auVar114._12_4_ = (int)auVar20._12_4_;
          auVar175 = vcvtdq2ps_avx(auVar114);
          auVar20 = vcmpps_avx(auVar20,auVar175,1);
          auVar20 = vandps_avx(auVar20,auVar98);
          auVar20 = vsubps_avx(auVar175,auVar20);
          auVar175 = vfmsub231ps_fma(auVar21,auVar20,auVar261);
          auVar21 = vfmsub231ps_fma(auVar175,auVar20,auVar274);
          auVar115._0_4_ = auVar21._0_4_ * auVar21._0_4_;
          auVar115._4_4_ = auVar21._4_4_ * auVar21._4_4_;
          auVar115._8_4_ = auVar21._8_4_ * auVar21._8_4_;
          auVar115._12_4_ = auVar21._12_4_ * auVar21._12_4_;
          auVar175 = vfmadd213ps_fma(auVar296,auVar21,auVar289);
          auVar175 = vfmadd213ps_fma(auVar175,auVar21,auVar306);
          auVar175 = vfmadd213ps_fma(auVar175,auVar21,auVar313);
          auVar186._8_4_ = 0x3e2aaaaa;
          auVar186._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar186._12_4_ = 0x3e2aaaaa;
          auVar175 = vfmadd213ps_fma(auVar175,auVar21,auVar186);
          auVar175 = vfmadd213ps_fma(auVar175,auVar21,auVar233);
          auVar175 = vfmadd213ps_fma(auVar175,auVar115,auVar21);
          auVar22._0_4_ = auVar175._0_4_ + 1.0;
          auVar22._4_4_ = auVar175._4_4_ + 1.0;
          auVar22._8_4_ = auVar175._8_4_ + 1.0;
          auVar22._12_4_ = auVar175._12_4_ + 1.0;
          auVar100._0_4_ = (int)auVar20._0_4_;
          auVar100._4_4_ = (int)auVar20._4_4_;
          auVar100._8_4_ = (int)auVar20._8_4_;
          auVar100._12_4_ = (int)auVar20._12_4_;
          auVar20 = vpslld_avx(auVar100,0x17);
          auVar20 = vpaddd_avx(auVar20,auVar98);
          auVar175 = vfmadd213ps_fma(auVar20,auVar22,auVar98);
          auVar20 = vrcpps_avx(auVar175);
          auVar116._0_4_ = auVar20._0_4_ + auVar20._0_4_;
          auVar116._4_4_ = auVar20._4_4_ + auVar20._4_4_;
          auVar116._8_4_ = auVar20._8_4_ + auVar20._8_4_;
          auVar116._12_4_ = auVar20._12_4_ + auVar20._12_4_;
          auVar133._8_4_ = 0x40000000;
          auVar133._0_8_ = 0x4000000040000000;
          auVar133._12_4_ = 0x40000000;
          auVar175 = vfmsub213ps_fma(auVar175,auVar116,auVar133);
          auVar20 = vfnmadd213ps_fma(auVar175,auVar20,auVar116);
          *(float *)*pauVar16 = auVar20._0_4_ + -1.0;
          *(float *)((long)*pauVar16 + 4) = auVar20._4_4_ + -1.0;
          *(float *)((long)*pauVar16 + 8) = auVar20._8_4_ + -1.0;
          *(float *)((long)*pauVar16 + 0xc) = auVar20._12_4_ + -1.0;
          pauVar16 = (undefined1 (*) [32])((long)*pauVar16 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if (uVar18 - uVar8 != 0 && (int)uVar8 <= (int)uVar18) {
          lVar11 = 0;
          do {
            fVar19 = tanhf(*(float *)((long)*pauVar16 + lVar11 * 4));
            *(float *)((long)*pauVar16 + lVar11 * 4) = fVar19;
            lVar11 = lVar11 + 1;
          } while (uVar18 - uVar8 != (int)lVar11);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != local_100._0_8_);
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_fma_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    return 0;
}